

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  uint uVar71;
  uint uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  bool bVar79;
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar91 [16];
  undefined1 auVar103 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar135;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar134;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar136;
  float fVar137;
  float fVar151;
  float fVar152;
  vint4 ai;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar160;
  undefined1 auVar145 [32];
  float fVar153;
  float fVar156;
  float fVar159;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar144 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar161;
  float fVar179;
  float fVar180;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar182;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar202;
  float fVar206;
  undefined1 auVar192 [28];
  float fVar203;
  float fVar204;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar205;
  float fVar207;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar208;
  float fVar209;
  float fVar225;
  float fVar227;
  vint4 ai_2;
  undefined1 auVar210 [16];
  float fVar229;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [28];
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar234;
  float fVar235;
  float fVar243;
  float fVar245;
  vint4 ai_1;
  undefined1 auVar236 [16];
  float fVar247;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar244;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar240 [28];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [28];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float s;
  float fVar279;
  float fVar281;
  undefined1 auVar276 [16];
  float fVar274;
  float fVar275;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar295;
  undefined1 auVar296 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar297 [64];
  float fVar305;
  undefined1 auVar306 [16];
  float fVar314;
  float fVar318;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar312;
  float fVar313;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar311 [64];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar326;
  float fVar329;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar345;
  float fVar349;
  float fVar350;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar348 [32];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar360 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 (*local_a28) [16];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_928;
  ulong local_920;
  undefined1 auStack_918 [24];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  undefined1 auStack_740 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  
  PVar2 = prim[1];
  uVar78 = (ulong)(byte)PVar2;
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar208 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar107._0_4_ = fVar208 * auVar7._0_4_;
  auVar107._4_4_ = fVar208 * auVar7._4_4_;
  auVar107._8_4_ = fVar208 * auVar7._8_4_;
  auVar107._12_4_ = fVar208 * auVar7._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar252._0_4_ = fVar208 * auVar8._0_4_;
  auVar252._4_4_ = fVar208 * auVar8._4_4_;
  auVar252._8_4_ = fVar208 * auVar8._8_4_;
  auVar252._12_4_ = fVar208 * auVar8._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar80 = vshufps_avx(auVar252,auVar252,0);
  auVar104 = vshufps_avx(auVar252,auVar252,0x55);
  auVar85 = vshufps_avx(auVar252,auVar252,0xaa);
  fVar208 = auVar85._0_4_;
  fVar161 = auVar85._4_4_;
  fVar225 = auVar85._8_4_;
  fVar179 = auVar85._12_4_;
  fVar234 = auVar104._0_4_;
  fVar243 = auVar104._4_4_;
  fVar245 = auVar104._8_4_;
  fVar247 = auVar104._12_4_;
  fVar227 = auVar80._0_4_;
  fVar180 = auVar80._4_4_;
  fVar229 = auVar80._8_4_;
  fVar181 = auVar80._12_4_;
  auVar322._0_4_ = fVar227 * auVar7._0_4_ + fVar234 * auVar8._0_4_ + fVar208 * auVar106._0_4_;
  auVar322._4_4_ = fVar180 * auVar7._4_4_ + fVar243 * auVar8._4_4_ + fVar161 * auVar106._4_4_;
  auVar322._8_4_ = fVar229 * auVar7._8_4_ + fVar245 * auVar8._8_4_ + fVar225 * auVar106._8_4_;
  auVar322._12_4_ = fVar181 * auVar7._12_4_ + fVar247 * auVar8._12_4_ + fVar179 * auVar106._12_4_;
  auVar346._0_4_ = fVar227 * auVar10._0_4_ + fVar234 * auVar167._0_4_ + auVar11._0_4_ * fVar208;
  auVar346._4_4_ = fVar180 * auVar10._4_4_ + fVar243 * auVar167._4_4_ + auVar11._4_4_ * fVar161;
  auVar346._8_4_ = fVar229 * auVar10._8_4_ + fVar245 * auVar167._8_4_ + auVar11._8_4_ * fVar225;
  auVar346._12_4_ = fVar181 * auVar10._12_4_ + fVar247 * auVar167._12_4_ + auVar11._12_4_ * fVar179;
  auVar253._0_4_ = fVar227 * auVar81._0_4_ + fVar234 * auVar82._0_4_ + auVar105._0_4_ * fVar208;
  auVar253._4_4_ = fVar180 * auVar81._4_4_ + fVar243 * auVar82._4_4_ + auVar105._4_4_ * fVar161;
  auVar253._8_4_ = fVar229 * auVar81._8_4_ + fVar245 * auVar82._8_4_ + auVar105._8_4_ * fVar225;
  auVar253._12_4_ = fVar181 * auVar81._12_4_ + fVar247 * auVar82._12_4_ + auVar105._12_4_ * fVar179;
  auVar80 = vshufps_avx(auVar107,auVar107,0);
  auVar104 = vshufps_avx(auVar107,auVar107,0x55);
  auVar85 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar208 = auVar85._0_4_;
  fVar161 = auVar85._4_4_;
  fVar225 = auVar85._8_4_;
  fVar179 = auVar85._12_4_;
  fVar234 = auVar104._0_4_;
  fVar243 = auVar104._4_4_;
  fVar245 = auVar104._8_4_;
  fVar247 = auVar104._12_4_;
  fVar227 = auVar80._0_4_;
  fVar180 = auVar80._4_4_;
  fVar229 = auVar80._8_4_;
  fVar181 = auVar80._12_4_;
  auVar87._0_4_ = fVar227 * auVar7._0_4_ + fVar234 * auVar8._0_4_ + fVar208 * auVar106._0_4_;
  auVar87._4_4_ = fVar180 * auVar7._4_4_ + fVar243 * auVar8._4_4_ + fVar161 * auVar106._4_4_;
  auVar87._8_4_ = fVar229 * auVar7._8_4_ + fVar245 * auVar8._8_4_ + fVar225 * auVar106._8_4_;
  auVar87._12_4_ = fVar181 * auVar7._12_4_ + fVar247 * auVar8._12_4_ + fVar179 * auVar106._12_4_;
  auVar104._0_4_ = fVar227 * auVar10._0_4_ + auVar11._0_4_ * fVar208 + fVar234 * auVar167._0_4_;
  auVar104._4_4_ = fVar180 * auVar10._4_4_ + auVar11._4_4_ * fVar161 + fVar243 * auVar167._4_4_;
  auVar104._8_4_ = fVar229 * auVar10._8_4_ + auVar11._8_4_ * fVar225 + fVar245 * auVar167._8_4_;
  auVar104._12_4_ = fVar181 * auVar10._12_4_ + auVar11._12_4_ * fVar179 + fVar247 * auVar167._12_4_;
  auVar80._0_4_ = fVar234 * auVar82._0_4_ + auVar105._0_4_ * fVar208 + fVar227 * auVar81._0_4_;
  auVar80._4_4_ = fVar243 * auVar82._4_4_ + auVar105._4_4_ * fVar161 + fVar180 * auVar81._4_4_;
  auVar80._8_4_ = fVar245 * auVar82._8_4_ + auVar105._8_4_ * fVar225 + fVar229 * auVar81._8_4_;
  auVar80._12_4_ = fVar247 * auVar82._12_4_ + auVar105._12_4_ * fVar179 + fVar181 * auVar81._12_4_;
  auVar236._8_4_ = 0x7fffffff;
  auVar236._0_8_ = 0x7fffffff7fffffff;
  auVar236._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar322,auVar236);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar162,1);
  auVar8 = vblendvps_avx(auVar322,auVar162,auVar7);
  auVar7 = vandps_avx(auVar346,auVar236);
  auVar7 = vcmpps_avx(auVar7,auVar162,1);
  auVar106 = vblendvps_avx(auVar346,auVar162,auVar7);
  auVar7 = vandps_avx(auVar253,auVar236);
  auVar7 = vcmpps_avx(auVar7,auVar162,1);
  auVar7 = vblendvps_avx(auVar253,auVar162,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  fVar234 = auVar10._0_4_;
  auVar85._0_4_ = fVar234 * auVar8._0_4_;
  fVar243 = auVar10._4_4_;
  auVar85._4_4_ = fVar243 * auVar8._4_4_;
  fVar245 = auVar10._8_4_;
  auVar85._8_4_ = fVar245 * auVar8._8_4_;
  fVar247 = auVar10._12_4_;
  auVar85._12_4_ = fVar247 * auVar8._12_4_;
  auVar254._8_4_ = 0x3f800000;
  auVar254._0_8_ = 0x3f8000003f800000;
  auVar254._12_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar254,auVar85);
  fVar234 = fVar234 + fVar234 * auVar8._0_4_;
  fVar243 = fVar243 + fVar243 * auVar8._4_4_;
  fVar245 = fVar245 + fVar245 * auVar8._8_4_;
  fVar247 = fVar247 + fVar247 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar106);
  fVar208 = auVar8._0_4_;
  auVar210._0_4_ = fVar208 * auVar106._0_4_;
  fVar225 = auVar8._4_4_;
  auVar210._4_4_ = fVar225 * auVar106._4_4_;
  fVar227 = auVar8._8_4_;
  auVar210._8_4_ = fVar227 * auVar106._8_4_;
  fVar229 = auVar8._12_4_;
  auVar210._12_4_ = fVar229 * auVar106._12_4_;
  auVar8 = vsubps_avx(auVar254,auVar210);
  fVar208 = fVar208 + fVar208 * auVar8._0_4_;
  fVar225 = fVar225 + fVar225 * auVar8._4_4_;
  fVar227 = fVar227 + fVar227 * auVar8._8_4_;
  fVar229 = fVar229 + fVar229 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar7);
  fVar161 = auVar8._0_4_;
  auVar163._0_4_ = fVar161 * auVar7._0_4_;
  fVar179 = auVar8._4_4_;
  auVar163._4_4_ = fVar179 * auVar7._4_4_;
  fVar180 = auVar8._8_4_;
  auVar163._8_4_ = fVar180 * auVar7._8_4_;
  fVar181 = auVar8._12_4_;
  auVar163._12_4_ = fVar181 * auVar7._12_4_;
  auVar7 = vsubps_avx(auVar254,auVar163);
  fVar161 = fVar161 + fVar161 * auVar7._0_4_;
  fVar179 = fVar179 + fVar179 * auVar7._4_4_;
  fVar180 = fVar180 + fVar180 * auVar7._8_4_;
  fVar181 = fVar181 + fVar181 * auVar7._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar106 = vsubps_avx(auVar7,auVar87);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar108._0_4_ = fVar234 * auVar106._0_4_;
  auVar108._4_4_ = fVar243 * auVar106._4_4_;
  auVar108._8_4_ = fVar245 * auVar106._8_4_;
  auVar108._12_4_ = fVar247 * auVar106._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar87);
  auVar183._0_4_ = fVar234 * auVar7._0_4_;
  auVar183._4_4_ = fVar243 * auVar7._4_4_;
  auVar183._8_4_ = fVar245 * auVar7._8_4_;
  auVar183._12_4_ = fVar247 * auVar7._12_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar106);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vsubps_avx(auVar7,auVar104);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar237._0_4_ = auVar8._0_4_ * fVar208;
  auVar237._4_4_ = auVar8._4_4_ * fVar225;
  auVar237._8_4_ = auVar8._8_4_ * fVar227;
  auVar237._12_4_ = auVar8._12_4_ * fVar229;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar104);
  auVar105._0_4_ = fVar208 * auVar7._0_4_;
  auVar105._4_4_ = fVar225 * auVar7._4_4_;
  auVar105._8_4_ = fVar227 * auVar7._8_4_;
  auVar105._12_4_ = fVar229 * auVar7._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar167);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar80);
  auVar211._0_4_ = auVar7._0_4_ * fVar161;
  auVar211._4_4_ = auVar7._4_4_ * fVar179;
  auVar211._8_4_ = auVar7._8_4_ * fVar180;
  auVar211._12_4_ = auVar7._12_4_ * fVar181;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar80);
  auVar81._0_4_ = auVar7._0_4_ * fVar161;
  auVar81._4_4_ = auVar7._4_4_ * fVar179;
  auVar81._8_4_ = auVar7._8_4_ * fVar180;
  auVar81._12_4_ = auVar7._12_4_ * fVar181;
  auVar7 = vpminsd_avx(auVar108,auVar183);
  auVar8 = vpminsd_avx(auVar237,auVar105);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar211,auVar81);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar276._4_4_ = uVar1;
  auVar276._0_4_ = uVar1;
  auVar276._8_4_ = uVar1;
  auVar276._12_4_ = uVar1;
  auVar8 = vmaxps_avx(auVar8,auVar276);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_640._0_4_ = auVar7._0_4_ * 0.99999964;
  local_640._4_4_ = auVar7._4_4_ * 0.99999964;
  local_640._8_4_ = auVar7._8_4_ * 0.99999964;
  local_640._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar108,auVar183);
  auVar8 = vpmaxsd_avx(auVar237,auVar105);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar211,auVar81);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar138._4_4_ = uVar1;
  auVar138._0_4_ = uVar1;
  auVar138._8_4_ = uVar1;
  auVar138._12_4_ = uVar1;
  auVar8 = vminps_avx(auVar8,auVar138);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar82._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar7 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar8 = vpcmpgtd_avx(auVar7,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_640,auVar82,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  uVar71 = vmovmskps_avx(auVar7);
  local_5c0 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  local_a28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_928 = prim;
LAB_00807528:
  uVar78 = (ulong)uVar71;
  if (uVar78 == 0) {
    return;
  }
  lVar73 = 0;
  if (uVar78 != 0) {
    for (; (uVar71 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  uVar78 = uVar78 - 1 & uVar78;
  uVar71 = *(uint *)(local_928 + 2);
  local_920 = (ulong)*(uint *)(local_928 + lVar73 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar71].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_920);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar5 = *(long *)&pGVar3[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar5 + (long)p_Var4 * uVar75);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (uVar75 + 1) * (long)p_Var4);
  lVar6 = 0;
  if (uVar78 != 0) {
    for (; (uVar78 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  if (((uVar78 != 0) && (uVar76 = uVar78 - 1 & uVar78, uVar76 != 0)) && (lVar6 = 0, uVar76 != 0)) {
    for (; (uVar76 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar10 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar208 = *(float *)(ray + k * 4 + 0x40);
  auVar323._4_4_ = fVar208;
  auVar323._0_4_ = fVar208;
  auVar323._8_4_ = fVar208;
  auVar323._12_4_ = fVar208;
  fStack_8d0 = fVar208;
  _local_8e0 = auVar323;
  fStack_8cc = fVar208;
  fStack_8c8 = fVar208;
  fStack_8c4 = fVar208;
  fVar161 = *(float *)(ray + k * 4 + 0x50);
  auVar347._4_4_ = fVar161;
  auVar347._0_4_ = fVar161;
  auVar347._8_4_ = fVar161;
  auVar347._12_4_ = fVar161;
  fStack_6d0 = fVar161;
  _local_6e0 = auVar347;
  fStack_6cc = fVar161;
  fStack_6c8 = fVar161;
  fStack_6c4 = fVar161;
  auVar106 = vunpcklps_avx(auVar323,auVar347);
  fVar225 = *(float *)(ray + k * 4 + 0x60);
  auVar355._4_4_ = fVar225;
  auVar355._0_4_ = fVar225;
  auVar355._8_4_ = fVar225;
  auVar355._12_4_ = fVar225;
  fStack_6f0 = fVar225;
  _local_700 = auVar355;
  fStack_6ec = fVar225;
  fStack_6e8 = fVar225;
  fStack_6e4 = fVar225;
  _local_9b0 = vinsertps_avx(auVar106,auVar355,0x28);
  auVar83._0_4_ = (auVar7._0_4_ + auVar8._0_4_) * 0.5;
  auVar83._4_4_ = (auVar7._4_4_ + auVar8._4_4_) * 0.5;
  auVar83._8_4_ = (auVar7._8_4_ + auVar8._8_4_) * 0.5;
  auVar83._12_4_ = (auVar7._12_4_ + auVar8._12_4_) * 0.5;
  auVar106 = vsubps_avx(auVar83,auVar10);
  auVar106 = vdpps_avx(auVar106,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar311 = ZEXT1664(local_9c0);
  auVar167 = vrcpss_avx(local_9c0,local_9c0);
  fVar179 = auVar106._0_4_ * auVar167._0_4_ * (2.0 - local_9c0._0_4_ * auVar167._0_4_);
  auVar167 = vshufps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),0);
  auVar212._0_4_ = auVar10._0_4_ + local_9b0._0_4_ * auVar167._0_4_;
  auVar212._4_4_ = auVar10._4_4_ + local_9b0._4_4_ * auVar167._4_4_;
  auVar212._8_4_ = auVar10._8_4_ + local_9b0._8_4_ * auVar167._8_4_;
  auVar212._12_4_ = auVar10._12_4_ + local_9b0._12_4_ * auVar167._12_4_;
  auVar106 = vblendps_avx(auVar212,_DAT_01f45a50,8);
  auVar11 = vsubps_avx(auVar7,auVar106);
  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + (uVar75 + 2) * (long)p_Var4),auVar106);
  auVar82 = vsubps_avx(auVar8,auVar106);
  auVar273 = ZEXT1664(auVar82);
  auVar105 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + (uVar75 + 3) * (long)p_Var4),auVar106);
  auVar7 = vshufps_avx(auVar11,auVar11,0);
  register0x00001250 = auVar7;
  _local_4a0 = auVar7;
  auVar7 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001250 = auVar7;
  _local_1e0 = auVar7;
  auVar7 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001250 = auVar7;
  _local_200 = auVar7;
  auVar7 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar7;
  _local_220 = auVar7;
  auVar7 = vshufps_avx(auVar82,auVar82,0);
  register0x00001290 = auVar7;
  _local_4c0 = auVar7;
  auVar7 = vshufps_avx(auVar82,auVar82,0x55);
  register0x00001290 = auVar7;
  _local_4e0 = auVar7;
  auVar7 = vshufps_avx(auVar82,auVar82,0xaa);
  register0x00001290 = auVar7;
  _local_500 = auVar7;
  auVar7 = vshufps_avx(auVar82,auVar82,0xff);
  register0x00001290 = auVar7;
  _local_520 = auVar7;
  auVar7 = vshufps_avx(auVar81,auVar81,0);
  auVar8 = vshufps_avx(auVar81,auVar81,0x55);
  register0x00001290 = auVar8;
  _local_540 = auVar8;
  auVar8 = vshufps_avx(auVar81,auVar81,0xaa);
  register0x00001290 = auVar8;
  _local_560 = auVar8;
  auVar8 = vshufps_avx(auVar81,auVar81,0xff);
  register0x00001290 = auVar8;
  _local_580 = auVar8;
  auVar8 = vshufps_avx(auVar105,auVar105,0);
  local_300._16_16_ = auVar8;
  local_300._0_16_ = auVar8;
  auVar8 = vshufps_avx(auVar105,auVar105,0x55);
  auVar106 = vshufps_avx(auVar105,auVar105,0xaa);
  register0x00001290 = auVar106;
  _local_5a0 = auVar106;
  auVar106 = vshufps_avx(auVar105,auVar105,0xff);
  register0x00001290 = auVar106;
  _local_240 = auVar106;
  auVar106 = ZEXT416((uint)(fVar208 * fVar208 + fVar161 * fVar161 + fVar225 * fVar225));
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  local_260._16_16_ = auVar106;
  local_260._0_16_ = auVar106;
  fVar208 = *(float *)(ray + k * 4 + 0x30);
  local_950 = ZEXT416((uint)fVar179);
  auVar106 = vshufps_avx(ZEXT416((uint)(fVar208 - fVar179)),ZEXT416((uint)(fVar208 - fVar179)),0);
  local_320._16_16_ = auVar106;
  local_320._0_16_ = auVar106;
  local_7d0 = vpshufd_avx(ZEXT416(uVar71),0);
  local_7e0 = vpshufd_avx(ZEXT416(*(uint *)(local_928 + lVar73 * 4 + 6)),0);
  register0x00001210 = auVar167;
  _local_8c0 = auVar167;
  uVar75 = 0;
  local_c88 = 1;
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_260,auVar93);
  auVar106 = vsqrtss_avx(local_9c0,local_9c0);
  auVar10 = vsqrtss_avx(local_9c0,local_9c0);
  local_630 = ZEXT816(0x3f80000000000000);
  do {
    auVar193._8_4_ = 0x3f800000;
    auVar193._0_8_ = 0x3f8000003f800000;
    auVar193._12_4_ = 0x3f800000;
    auVar193._16_4_ = 0x3f800000;
    auVar193._20_4_ = 0x3f800000;
    auVar193._24_4_ = 0x3f800000;
    auVar193._28_4_ = 0x3f800000;
    auVar167 = vmovshdup_avx(local_630);
    auVar104 = vsubps_avx(auVar167,local_630);
    auVar167 = vshufps_avx(local_630,local_630,0);
    local_800._16_16_ = auVar167;
    local_800._0_16_ = auVar167;
    auVar80 = vshufps_avx(auVar104,auVar104,0);
    local_820._16_16_ = auVar80;
    local_820._0_16_ = auVar80;
    fVar225 = auVar80._0_4_;
    fVar234 = auVar80._4_4_;
    fVar135 = auVar80._8_4_;
    fVar182 = auVar80._12_4_;
    fVar205 = auVar167._0_4_;
    auVar175._0_4_ = fVar205 + fVar225 * 0.0;
    fVar207 = auVar167._4_4_;
    auVar175._4_4_ = fVar207 + fVar234 * 0.14285715;
    fVar359 = auVar167._8_4_;
    auVar175._8_4_ = fVar359 + fVar135 * 0.2857143;
    fVar362 = auVar167._12_4_;
    auVar175._12_4_ = fVar362 + fVar182 * 0.42857146;
    auVar175._16_4_ = fVar205 + fVar225 * 0.5714286;
    auVar175._20_4_ = fVar207 + fVar234 * 0.71428573;
    auVar175._24_4_ = fVar359 + fVar135 * 0.8571429;
    auVar175._28_4_ = fVar362 + fVar182;
    auVar120 = vsubps_avx(auVar193,auVar175);
    local_a20._4_4_ = auVar175._4_4_ * auVar175._4_4_;
    local_a20._0_4_ = auVar175._0_4_ * auVar175._0_4_;
    fStack_a18 = auVar175._8_4_ * auVar175._8_4_;
    fStack_a14 = auVar175._12_4_ * auVar175._12_4_;
    fStack_a10 = auVar175._16_4_ * auVar175._16_4_;
    fStack_a0c = auVar175._20_4_ * auVar175._20_4_;
    fStack_a08 = auVar175._24_4_ * auVar175._24_4_;
    fStack_a04 = fVar362;
    fVar247 = auVar175._0_4_ * 3.0;
    fVar200 = auVar175._4_4_ * 3.0;
    fVar201 = auVar175._8_4_ * 3.0;
    fVar202 = auVar175._12_4_ * 3.0;
    fVar203 = auVar175._16_4_ * 3.0;
    fVar204 = auVar175._20_4_ * 3.0;
    fVar206 = auVar175._24_4_ * 3.0;
    fVar161 = auVar120._0_4_;
    auVar297._0_4_ = fVar161 * fVar161;
    fVar179 = auVar120._4_4_;
    auVar297._4_4_ = fVar179 * fVar179;
    fVar227 = auVar120._8_4_;
    auVar297._8_4_ = fVar227 * fVar227;
    fVar180 = auVar120._12_4_;
    auVar297._12_4_ = fVar180 * fVar180;
    fVar229 = auVar120._16_4_;
    auVar297._16_4_ = fVar229 * fVar229;
    fVar181 = auVar120._20_4_;
    auVar297._20_4_ = fVar181 * fVar181;
    fVar243 = auVar120._24_4_;
    auVar297._28_36_ = auVar273._28_36_;
    auVar297._24_4_ = fVar243 * fVar243;
    fVar245 = auVar120._28_4_;
    fVar209 = (auVar297._0_4_ * (fVar161 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar226 = (auVar297._4_4_ * (fVar179 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar228 = (auVar297._8_4_ * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar230 = (auVar297._12_4_ * (fVar180 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar231 = (auVar297._16_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar232 = (auVar297._20_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar233 = (auVar297._24_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar274 = -fVar161 * auVar175._0_4_ * auVar175._0_4_ * 0.5;
    fVar279 = -fVar179 * auVar175._4_4_ * auVar175._4_4_ * 0.5;
    fVar281 = -fVar227 * auVar175._8_4_ * auVar175._8_4_ * 0.5;
    fVar283 = -fVar180 * auVar175._12_4_ * auVar175._12_4_ * 0.5;
    fVar285 = -fVar229 * auVar175._16_4_ * auVar175._16_4_ * 0.5;
    fVar288 = -fVar181 * auVar175._20_4_ * auVar175._20_4_ * 0.5;
    fVar291 = -fVar243 * auVar175._24_4_ * auVar175._24_4_ * 0.5;
    fVar287 = auVar8._0_4_;
    fVar290 = auVar8._4_4_;
    fVar293 = auVar8._8_4_;
    fVar134 = auVar8._12_4_;
    fVar137 = auVar7._0_4_;
    fVar153 = auVar7._4_4_;
    fVar156 = auVar7._8_4_;
    fVar159 = auVar7._12_4_;
    fVar304 = local_300._28_4_ + fVar159;
    fVar318 = auVar311._28_4_ + fVar159;
    fVar345 = (auVar175._0_4_ * auVar175._0_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar349 = (auVar175._4_4_ * auVar175._4_4_ * (fVar200 + -5.0) + 2.0) * 0.5;
    fVar350 = (auVar175._8_4_ * auVar175._8_4_ * (fVar201 + -5.0) + 2.0) * 0.5;
    fVar351 = (auVar175._12_4_ * auVar175._12_4_ * (fVar202 + -5.0) + 2.0) * 0.5;
    fVar352 = (auVar175._16_4_ * auVar175._16_4_ * (fVar203 + -5.0) + 2.0) * 0.5;
    fVar353 = (auVar175._20_4_ * auVar175._20_4_ * (fVar204 + -5.0) + 2.0) * 0.5;
    fVar354 = (auVar175._24_4_ * auVar175._24_4_ * (fVar206 + -5.0) + 2.0) * 0.5;
    fVar344 = -auVar175._28_4_;
    fVar319 = -auVar175._0_4_ * fVar161 * fVar161 * 0.5;
    fVar326 = -auVar175._4_4_ * fVar179 * fVar179 * 0.5;
    fVar329 = -auVar175._8_4_ * fVar227 * fVar227 * 0.5;
    fVar332 = -auVar175._12_4_ * fVar180 * fVar180 * 0.5;
    fVar335 = -auVar175._16_4_ * fVar229 * fVar229 * 0.5;
    fVar338 = -auVar175._20_4_ * fVar181 * fVar181 * 0.5;
    fVar341 = -auVar175._24_4_ * fVar243 * fVar243 * 0.5;
    local_9a0 = fVar319 * (float)local_4a0._0_4_ +
                fVar345 * (float)local_4c0._0_4_ + local_300._0_4_ * fVar274 + fVar137 * fVar209;
    fStack_99c = fVar326 * (float)local_4a0._4_4_ +
                 fVar349 * (float)local_4c0._4_4_ + local_300._4_4_ * fVar279 + fVar153 * fVar226;
    fStack_998 = fVar329 * fStack_498 +
                 fVar350 * fStack_4b8 + local_300._8_4_ * fVar281 + fVar156 * fVar228;
    fStack_994 = fVar332 * fStack_494 +
                 fVar351 * fStack_4b4 + local_300._12_4_ * fVar283 + fVar159 * fVar230;
    fStack_990 = fVar335 * fStack_490 +
                 fVar352 * fStack_4b0 + local_300._16_4_ * fVar285 + fVar137 * fVar231;
    fStack_98c = fVar338 * fStack_48c +
                 fVar353 * fStack_4ac + local_300._20_4_ * fVar288 + fVar153 * fVar232;
    fStack_988 = fVar341 * fStack_488 +
                 fVar354 * fStack_4a8 + local_300._24_4_ * fVar291 + fVar156 * fVar233;
    fStack_984 = fVar159 + 2.0 + -fVar245 + fVar304;
    fVar275 = (float)local_1e0._0_4_ * fVar319 +
              fVar345 * (float)local_4e0._0_4_ +
              fVar287 * fVar274 + fVar209 * (float)local_540._0_4_;
    fVar280 = (float)local_1e0._4_4_ * fVar326 +
              fVar349 * (float)local_4e0._4_4_ +
              fVar290 * fVar279 + fVar226 * (float)local_540._4_4_;
    fVar282 = fStack_1d8 * fVar329 + fVar350 * fStack_4d8 + fVar293 * fVar281 + fVar228 * fStack_538
    ;
    fVar284 = fStack_1d4 * fVar332 + fVar351 * fStack_4d4 + fVar134 * fVar283 + fVar230 * fStack_534
    ;
    fVar286 = fStack_1d0 * fVar335 + fVar352 * fStack_4d0 + fVar287 * fVar285 + fVar231 * fStack_530
    ;
    fVar289 = fStack_1cc * fVar338 + fVar353 * fStack_4cc + fVar290 * fVar288 + fVar232 * fStack_52c
    ;
    fVar292 = fStack_1c8 * fVar341 + fVar354 * fStack_4c8 + fVar293 * fVar291 + fVar233 * fStack_528
    ;
    fVar294 = fStack_984 + fVar304 + fVar318;
    fVar136 = (float)local_200._0_4_ * fVar319 +
              fVar345 * (float)local_500._0_4_ +
              fVar274 * (float)local_5a0._0_4_ + fVar209 * (float)local_560._0_4_;
    fVar151 = (float)local_200._4_4_ * fVar326 +
              fVar349 * (float)local_500._4_4_ +
              fVar279 * (float)local_5a0._4_4_ + fVar226 * (float)local_560._4_4_;
    fVar152 = fStack_1f8 * fVar329 +
              fVar350 * fStack_4f8 + fVar281 * fStack_598 + fVar228 * fStack_558;
    fVar154 = fStack_1f4 * fVar332 +
              fVar351 * fStack_4f4 + fVar283 * fStack_594 + fVar230 * fStack_554;
    fVar155 = fStack_1f0 * fVar335 +
              fVar352 * fStack_4f0 + fVar285 * fStack_590 + fVar231 * fStack_550;
    fVar157 = fStack_1ec * fVar338 +
              fVar353 * fStack_4ec + fVar288 * fStack_58c + fVar232 * fStack_54c;
    fVar158 = fStack_1e8 * fVar341 +
              fVar354 * fStack_4e8 + fVar291 * fStack_588 + fVar233 * fStack_548;
    fVar160 = fVar294 + fVar318 + fVar134 + fVar159;
    auVar218._0_4_ =
         (float)local_220._0_4_ * fVar319 +
         fVar345 * (float)local_520._0_4_ +
         fVar274 * (float)local_240._0_4_ + fVar209 * (float)local_580._0_4_;
    auVar218._4_4_ =
         (float)local_220._4_4_ * fVar326 +
         fVar349 * (float)local_520._4_4_ +
         fVar279 * (float)local_240._4_4_ + fVar226 * (float)local_580._4_4_;
    auVar218._8_4_ =
         fStack_218 * fVar329 + fVar350 * fStack_518 + fVar281 * fStack_238 + fVar228 * fStack_578;
    auVar218._12_4_ =
         fStack_214 * fVar332 + fVar351 * fStack_514 + fVar283 * fStack_234 + fVar230 * fStack_574;
    auVar218._16_4_ =
         fStack_210 * fVar335 + fVar352 * fStack_510 + fVar285 * fStack_230 + fVar231 * fStack_570;
    auVar218._20_4_ =
         fStack_20c * fVar338 + fVar353 * fStack_50c + fVar288 * fStack_22c + fVar232 * fStack_56c;
    auVar218._24_4_ =
         fStack_208 * fVar341 + fVar354 * fStack_508 + fVar291 * fStack_228 + fVar233 * fStack_568;
    auVar218._28_4_ = fVar294 + fVar159 + 2.0 + -fVar245 + -3.0;
    fVar332 = auVar175._28_4_ + auVar175._28_4_;
    auVar17._4_4_ = (fVar179 + fVar179) * auVar175._4_4_;
    auVar17._0_4_ = (fVar161 + fVar161) * auVar175._0_4_;
    auVar17._8_4_ = (fVar227 + fVar227) * auVar175._8_4_;
    auVar17._12_4_ = (fVar180 + fVar180) * auVar175._12_4_;
    auVar17._16_4_ = (fVar229 + fVar229) * auVar175._16_4_;
    auVar17._20_4_ = (fVar181 + fVar181) * auVar175._20_4_;
    auVar17._24_4_ = (fVar243 + fVar243) * auVar175._24_4_;
    auVar17._28_4_ = fVar332;
    auVar120 = vsubps_avx(auVar17,auVar297._0_32_);
    auVar12._4_4_ = (fVar179 + fVar179) * (fVar200 + 2.0);
    auVar12._0_4_ = (fVar161 + fVar161) * (fVar247 + 2.0);
    auVar12._8_4_ = (fVar227 + fVar227) * (fVar201 + 2.0);
    auVar12._12_4_ = (fVar180 + fVar180) * (fVar202 + 2.0);
    auVar12._16_4_ = (fVar229 + fVar229) * (fVar203 + 2.0);
    auVar12._20_4_ = (fVar181 + fVar181) * (fVar204 + 2.0);
    auVar12._24_4_ = (fVar243 + fVar243) * (fVar206 + 2.0);
    auVar12._28_4_ = 0x40400000;
    auVar13._4_4_ = fVar179 * fVar179 * 3.0;
    auVar13._0_4_ = fVar161 * fVar161 * 3.0;
    auVar13._8_4_ = fVar227 * fVar227 * 3.0;
    auVar13._12_4_ = fVar180 * fVar180 * 3.0;
    auVar13._16_4_ = fVar229 * fVar229 * 3.0;
    auVar13._20_4_ = fVar181 * fVar181 * 3.0;
    auVar13._24_4_ = fVar243 * fVar243 * 3.0;
    auVar13._28_4_ = fVar245;
    auVar93 = vsubps_avx(auVar12,auVar13);
    auVar17 = vsubps_avx(_local_a20,auVar17);
    fVar288 = auVar120._0_4_ * 0.5;
    fVar291 = auVar120._4_4_ * 0.5;
    fVar304 = auVar120._8_4_ * 0.5;
    fVar318 = auVar120._12_4_ * 0.5;
    fVar319 = auVar120._16_4_ * 0.5;
    fVar326 = auVar120._20_4_ * 0.5;
    fVar329 = auVar120._24_4_ * 0.5;
    fVar230 = (auVar175._0_4_ * fVar247 + (auVar175._0_4_ + auVar175._0_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar233 = (auVar175._4_4_ * fVar200 + (auVar175._4_4_ + auVar175._4_4_) * (fVar200 + -5.0)) *
              0.5;
    fVar274 = (auVar175._8_4_ * fVar201 + (auVar175._8_4_ + auVar175._8_4_) * (fVar201 + -5.0)) *
              0.5;
    fVar279 = (auVar175._12_4_ * fVar202 + (auVar175._12_4_ + auVar175._12_4_) * (fVar202 + -5.0)) *
              0.5;
    fVar281 = (auVar175._16_4_ * fVar203 + (auVar175._16_4_ + auVar175._16_4_) * (fVar203 + -5.0)) *
              0.5;
    fVar283 = (auVar175._20_4_ * fVar204 + (auVar175._20_4_ + auVar175._20_4_) * (fVar204 + -5.0)) *
              0.5;
    fVar285 = (auVar175._24_4_ * fVar206 + (auVar175._24_4_ + auVar175._24_4_) * (fVar206 + -5.0)) *
              0.5;
    fVar161 = auVar93._0_4_ * 0.5;
    fVar179 = auVar93._4_4_ * 0.5;
    fVar227 = auVar93._8_4_ * 0.5;
    fVar180 = auVar93._12_4_ * 0.5;
    fVar243 = auVar93._16_4_ * 0.5;
    fVar247 = auVar93._20_4_ * 0.5;
    fVar202 = auVar93._24_4_ * 0.5;
    fVar229 = auVar17._0_4_ * 0.5;
    fVar181 = auVar17._4_4_ * 0.5;
    fVar200 = auVar17._8_4_ * 0.5;
    fVar203 = auVar17._12_4_ * 0.5;
    fVar204 = auVar17._16_4_ * 0.5;
    fVar226 = auVar17._20_4_ * 0.5;
    fVar228 = auVar17._24_4_ * 0.5;
    fVar232 = auVar175._28_4_ + -4.0 + auVar93._28_4_ + auVar17._28_4_ + 3.0;
    auVar167 = vpermilps_avx(ZEXT416((uint)(auVar104._0_4_ * 0.04761905)),0);
    fVar206 = auVar167._0_4_;
    fVar351 = fVar206 * (fVar288 * (float)local_4a0._0_4_ +
                        fVar230 * (float)local_4c0._0_4_ +
                        fVar161 * fVar137 + local_300._0_4_ * fVar229);
    fVar209 = auVar167._4_4_;
    fVar353 = fVar209 * (fVar291 * (float)local_4a0._4_4_ +
                        fVar233 * (float)local_4c0._4_4_ +
                        fVar179 * fVar153 + local_300._4_4_ * fVar181);
    local_a20._4_4_ = fVar353;
    local_a20._0_4_ = fVar351;
    fVar231 = auVar167._8_4_;
    fVar260 = fVar231 * (fVar304 * fStack_498 +
                        fVar274 * fStack_4b8 + fVar227 * fVar156 + local_300._8_4_ * fVar200);
    fStack_a18 = fVar260;
    fVar201 = auVar167._12_4_;
    fVar262 = fVar201 * (fVar318 * fStack_494 +
                        fVar279 * fStack_4b4 + fVar180 * fVar159 + local_300._12_4_ * fVar203);
    fStack_a14 = fVar262;
    fVar264 = fVar206 * (fVar319 * fStack_490 +
                        fVar281 * fStack_4b0 + fVar243 * fVar137 + local_300._16_4_ * fVar204);
    fStack_a10 = fVar264;
    fVar266 = fVar209 * (fVar326 * fStack_48c +
                        fVar283 * fStack_4ac + fVar247 * fVar153 + local_300._20_4_ * fVar226);
    fStack_a0c = fVar266;
    fVar268 = fVar231 * (fVar329 * fStack_488 +
                        fVar285 * fStack_4a8 + fVar202 * fVar156 + local_300._24_4_ * fVar228);
    fStack_a08 = fVar268;
    fStack_a04 = fVar245 + fVar245 + auVar120._28_4_ + fVar245 + fVar245 + -4.0;
    fVar305 = fVar206 * ((float)local_1e0._0_4_ * fVar288 +
                        fVar230 * (float)local_4e0._0_4_ +
                        fVar161 * (float)local_540._0_4_ + fVar229 * fVar287);
    fVar312 = fVar209 * ((float)local_1e0._4_4_ * fVar291 +
                        fVar233 * (float)local_4e0._4_4_ +
                        fVar179 * (float)local_540._4_4_ + fVar181 * fVar290);
    auVar16._4_4_ = fVar312;
    auVar16._0_4_ = fVar305;
    fVar313 = fVar231 * (fStack_1d8 * fVar304 +
                        fVar274 * fStack_4d8 + fVar227 * fStack_538 + fVar200 * fVar293);
    auVar16._8_4_ = fVar313;
    fVar314 = fVar201 * (fStack_1d4 * fVar318 +
                        fVar279 * fStack_4d4 + fVar180 * fStack_534 + fVar203 * fVar134);
    auVar16._12_4_ = fVar314;
    fVar315 = fVar206 * (fStack_1d0 * fVar319 +
                        fVar281 * fStack_4d0 + fVar243 * fStack_530 + fVar204 * fVar287);
    auVar16._16_4_ = fVar315;
    fVar316 = fVar209 * (fStack_1cc * fVar326 +
                        fVar283 * fStack_4cc + fVar247 * fStack_52c + fVar226 * fVar290);
    auVar16._20_4_ = fVar316;
    fVar317 = fVar231 * (fStack_1c8 * fVar329 +
                        fVar285 * fStack_4c8 + fVar202 * fStack_528 + fVar228 * fVar293);
    auVar16._24_4_ = fVar317;
    auVar16._28_4_ = fStack_1e4;
    fVar320 = fVar206 * ((float)local_200._0_4_ * fVar288 +
                        fVar161 * (float)local_560._0_4_ + fVar229 * (float)local_5a0._0_4_ +
                        fVar230 * (float)local_500._0_4_);
    fVar327 = fVar209 * ((float)local_200._4_4_ * fVar291 +
                        fVar179 * (float)local_560._4_4_ + fVar181 * (float)local_5a0._4_4_ +
                        fVar233 * (float)local_500._4_4_);
    auVar20._4_4_ = fVar327;
    auVar20._0_4_ = fVar320;
    fVar330 = fVar231 * (fStack_1f8 * fVar304 +
                        fVar227 * fStack_558 + fVar200 * fStack_598 + fVar274 * fStack_4f8);
    auVar20._8_4_ = fVar330;
    fVar333 = fVar201 * (fStack_1f4 * fVar318 +
                        fVar180 * fStack_554 + fVar203 * fStack_594 + fVar279 * fStack_4f4);
    auVar20._12_4_ = fVar333;
    fVar336 = fVar206 * (fStack_1f0 * fVar319 +
                        fVar243 * fStack_550 + fVar204 * fStack_590 + fVar281 * fStack_4f0);
    auVar20._16_4_ = fVar336;
    fVar339 = fVar209 * (fStack_1ec * fVar326 +
                        fVar247 * fStack_54c + fVar226 * fStack_58c + fVar283 * fStack_4ec);
    auVar20._20_4_ = fVar339;
    fVar342 = fVar231 * (fStack_1e8 * fVar329 +
                        fVar202 * fStack_548 + fVar228 * fStack_588 + fVar285 * fStack_4e8);
    auVar20._24_4_ = fVar342;
    auVar20._28_4_ = fVar344;
    fVar229 = fVar206 * ((float)local_220._0_4_ * fVar288 +
                        fVar230 * (float)local_520._0_4_ +
                        fVar161 * (float)local_580._0_4_ + (float)local_240._0_4_ * fVar229);
    fVar181 = fVar209 * ((float)local_220._4_4_ * fVar291 +
                        fVar233 * (float)local_520._4_4_ +
                        fVar179 * (float)local_580._4_4_ + (float)local_240._4_4_ * fVar181);
    auVar14._4_4_ = fVar181;
    auVar14._0_4_ = fVar229;
    fVar200 = fVar231 * (fStack_218 * fVar304 +
                        fVar274 * fStack_518 + fVar227 * fStack_578 + fStack_238 * fVar200);
    auVar14._8_4_ = fVar200;
    fVar201 = fVar201 * (fStack_214 * fVar318 +
                        fVar279 * fStack_514 + fVar180 * fStack_574 + fStack_234 * fVar203);
    auVar14._12_4_ = fVar201;
    fVar206 = fVar206 * (fStack_210 * fVar319 +
                        fVar281 * fStack_510 + fVar243 * fStack_570 + fStack_230 * fVar204);
    auVar14._16_4_ = fVar206;
    fVar209 = fVar209 * (fStack_20c * fVar326 +
                        fVar283 * fStack_50c + fVar247 * fStack_56c + fStack_22c * fVar226);
    auVar14._20_4_ = fVar209;
    fVar231 = fVar231 * (fStack_208 * fVar329 +
                        fVar285 * fStack_508 + fVar202 * fStack_568 + fStack_228 * fVar228);
    auVar14._24_4_ = fVar231;
    auVar14._28_4_ = fVar232;
    auVar66._4_4_ = fVar280;
    auVar66._0_4_ = fVar275;
    auVar66._8_4_ = fVar282;
    auVar66._12_4_ = fVar284;
    auVar66._16_4_ = fVar286;
    auVar66._20_4_ = fVar289;
    auVar66._24_4_ = fVar292;
    auVar66._28_4_ = fVar294;
    auVar120 = vperm2f128_avx(auVar66,auVar66,1);
    auVar120 = vshufps_avx(auVar120,auVar66,0x30);
    auVar12 = vshufps_avx(auVar66,auVar120,0x29);
    auVar64._4_4_ = fVar151;
    auVar64._0_4_ = fVar136;
    auVar64._8_4_ = fVar152;
    auVar64._12_4_ = fVar154;
    auVar64._16_4_ = fVar155;
    auVar64._20_4_ = fVar157;
    auVar64._24_4_ = fVar158;
    auVar64._28_4_ = fVar160;
    auVar120 = vperm2f128_avx(auVar64,auVar64,1);
    auVar120 = vshufps_avx(auVar120,auVar64,0x30);
    auVar13 = vshufps_avx(auVar64,auVar120,0x29);
    auVar93 = vsubps_avx(auVar218,auVar14);
    auVar120 = vperm2f128_avx(auVar93,auVar93,1);
    auVar120 = vshufps_avx(auVar120,auVar93,0x30);
    auVar14 = vshufps_avx(auVar93,auVar120,0x29);
    local_2a0 = vsubps_avx(auVar12,auVar66);
    local_280 = vsubps_avx(auVar13,auVar64);
    fVar179 = local_2a0._0_4_;
    fVar243 = local_2a0._4_4_;
    auVar15._4_4_ = fVar327 * fVar243;
    auVar15._0_4_ = fVar320 * fVar179;
    fVar202 = local_2a0._8_4_;
    auVar15._8_4_ = fVar330 * fVar202;
    fVar226 = local_2a0._12_4_;
    auVar15._12_4_ = fVar333 * fVar226;
    fVar233 = local_2a0._16_4_;
    auVar15._16_4_ = fVar336 * fVar233;
    fVar285 = local_2a0._20_4_;
    auVar15._20_4_ = fVar339 * fVar285;
    fVar319 = local_2a0._24_4_;
    auVar15._24_4_ = fVar342 * fVar319;
    auVar15._28_4_ = auVar93._28_4_;
    fVar227 = local_280._0_4_;
    fVar245 = local_280._4_4_;
    auVar307._4_4_ = fVar312 * fVar245;
    auVar307._0_4_ = fVar305 * fVar227;
    fVar203 = local_280._8_4_;
    auVar307._8_4_ = fVar313 * fVar203;
    fVar228 = local_280._12_4_;
    auVar307._12_4_ = fVar314 * fVar228;
    fVar274 = local_280._16_4_;
    auVar307._16_4_ = fVar315 * fVar274;
    fVar288 = local_280._20_4_;
    auVar307._20_4_ = fVar316 * fVar288;
    fVar326 = local_280._24_4_;
    auVar307._24_4_ = fVar317 * fVar326;
    auVar307._28_4_ = auVar120._28_4_;
    auVar307 = vsubps_avx(auVar307,auVar15);
    auVar68._4_4_ = fStack_99c;
    auVar68._0_4_ = local_9a0;
    auVar68._8_4_ = fStack_998;
    auVar68._12_4_ = fStack_994;
    auVar68._16_4_ = fStack_990;
    auVar68._20_4_ = fStack_98c;
    auVar68._24_4_ = fStack_988;
    auVar68._28_4_ = fStack_984;
    auVar120 = vperm2f128_avx(auVar68,auVar68,1);
    auVar120 = vshufps_avx(auVar120,auVar68,0x30);
    auVar15 = vshufps_avx(auVar68,auVar120,0x29);
    local_720 = vsubps_avx(auVar15,auVar68);
    auVar18._4_4_ = fVar353 * fVar245;
    auVar18._0_4_ = fVar351 * fVar227;
    auVar18._8_4_ = fVar260 * fVar203;
    auVar18._12_4_ = fVar262 * fVar228;
    auVar18._16_4_ = fVar264 * fVar274;
    auVar18._20_4_ = fVar266 * fVar288;
    auVar18._24_4_ = fVar268 * fVar326;
    auVar18._28_4_ = auVar120._28_4_;
    fVar180 = local_720._0_4_;
    fVar247 = local_720._4_4_;
    auVar278._4_4_ = fVar327 * fVar247;
    auVar278._0_4_ = fVar320 * fVar180;
    fVar204 = local_720._8_4_;
    auVar278._8_4_ = fVar330 * fVar204;
    fVar230 = local_720._12_4_;
    auVar278._12_4_ = fVar333 * fVar230;
    fVar279 = local_720._16_4_;
    auVar278._16_4_ = fVar336 * fVar279;
    fVar291 = local_720._20_4_;
    auVar278._20_4_ = fVar339 * fVar291;
    fVar329 = local_720._24_4_;
    auVar278._24_4_ = fVar342 * fVar329;
    auVar278._28_4_ = fVar160;
    auVar18 = vsubps_avx(auVar278,auVar18);
    auVar19._4_4_ = fVar312 * fVar247;
    auVar19._0_4_ = fVar305 * fVar180;
    auVar19._8_4_ = fVar313 * fVar204;
    auVar19._12_4_ = fVar314 * fVar230;
    auVar19._16_4_ = fVar315 * fVar279;
    auVar19._20_4_ = fVar316 * fVar291;
    auVar19._24_4_ = fVar317 * fVar329;
    auVar19._28_4_ = fVar160;
    auVar21._4_4_ = fVar243 * fVar353;
    auVar21._0_4_ = fVar179 * fVar351;
    auVar21._8_4_ = fVar202 * fVar260;
    auVar21._12_4_ = fVar226 * fVar262;
    auVar21._16_4_ = fVar233 * fVar264;
    auVar21._20_4_ = fVar285 * fVar266;
    auVar21._24_4_ = fVar319 * fVar268;
    auVar21._28_4_ = fVar332;
    auVar278 = vsubps_avx(auVar21,auVar19);
    fVar161 = auVar278._28_4_;
    auVar176._0_4_ = fVar180 * fVar180 + fVar179 * fVar179 + fVar227 * fVar227;
    auVar176._4_4_ = fVar247 * fVar247 + fVar243 * fVar243 + fVar245 * fVar245;
    auVar176._8_4_ = fVar204 * fVar204 + fVar202 * fVar202 + fVar203 * fVar203;
    auVar176._12_4_ = fVar230 * fVar230 + fVar226 * fVar226 + fVar228 * fVar228;
    auVar176._16_4_ = fVar279 * fVar279 + fVar233 * fVar233 + fVar274 * fVar274;
    auVar176._20_4_ = fVar291 * fVar291 + fVar285 * fVar285 + fVar288 * fVar288;
    auVar176._24_4_ = fVar329 * fVar329 + fVar319 * fVar319 + fVar326 * fVar326;
    auVar176._28_4_ = fVar161 + fVar161 + auVar307._28_4_;
    auVar120 = vrcpps_avx(auVar176);
    fVar281 = auVar120._0_4_;
    fVar283 = auVar120._4_4_;
    auVar22._4_4_ = fVar283 * auVar176._4_4_;
    auVar22._0_4_ = fVar281 * auVar176._0_4_;
    fVar304 = auVar120._8_4_;
    auVar22._8_4_ = fVar304 * auVar176._8_4_;
    fVar318 = auVar120._12_4_;
    auVar22._12_4_ = fVar318 * auVar176._12_4_;
    fVar287 = auVar120._16_4_;
    auVar22._16_4_ = fVar287 * auVar176._16_4_;
    fVar290 = auVar120._20_4_;
    auVar22._20_4_ = fVar290 * auVar176._20_4_;
    fVar293 = auVar120._24_4_;
    auVar22._24_4_ = fVar293 * auVar176._24_4_;
    auVar22._28_4_ = fVar332;
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = 0x3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar145._16_4_ = 0x3f800000;
    auVar145._20_4_ = 0x3f800000;
    auVar145._24_4_ = 0x3f800000;
    auVar145._28_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar145,auVar22);
    fVar281 = fVar281 + fVar281 * auVar19._0_4_;
    fVar283 = fVar283 + fVar283 * auVar19._4_4_;
    fVar304 = fVar304 + fVar304 * auVar19._8_4_;
    fVar318 = fVar318 + fVar318 * auVar19._12_4_;
    fVar287 = fVar287 + fVar287 * auVar19._16_4_;
    fVar290 = fVar290 + fVar290 * auVar19._20_4_;
    fVar293 = fVar293 + fVar293 * auVar19._24_4_;
    auVar93 = vperm2f128_avx(auVar16,auVar16,1);
    auVar93 = vshufps_avx(auVar93,auVar16,0x30);
    auVar93 = vshufps_avx(auVar16,auVar93,0x29);
    auVar17 = vperm2f128_avx(auVar20,auVar20,1);
    auVar17 = vshufps_avx(auVar17,auVar20,0x30);
    auVar16 = vshufps_avx(auVar20,auVar17,0x29);
    fVar321 = auVar16._0_4_;
    fVar328 = auVar16._4_4_;
    auVar23._4_4_ = fVar328 * fVar243;
    auVar23._0_4_ = fVar321 * fVar179;
    fVar331 = auVar16._8_4_;
    auVar23._8_4_ = fVar331 * fVar202;
    fVar334 = auVar16._12_4_;
    auVar23._12_4_ = fVar334 * fVar226;
    fVar337 = auVar16._16_4_;
    auVar23._16_4_ = fVar337 * fVar233;
    fVar340 = auVar16._20_4_;
    auVar23._20_4_ = fVar340 * fVar285;
    fVar343 = auVar16._24_4_;
    auVar23._24_4_ = fVar343 * fVar319;
    auVar23._28_4_ = auVar17._28_4_;
    fVar137 = auVar93._0_4_;
    fVar345 = auVar93._4_4_;
    auVar24._4_4_ = fVar345 * fVar245;
    auVar24._0_4_ = fVar137 * fVar227;
    fVar153 = auVar93._8_4_;
    auVar24._8_4_ = fVar153 * fVar203;
    fVar349 = auVar93._12_4_;
    auVar24._12_4_ = fVar349 * fVar228;
    fVar156 = auVar93._16_4_;
    auVar24._16_4_ = fVar156 * fVar274;
    fVar350 = auVar93._20_4_;
    auVar24._20_4_ = fVar350 * fVar288;
    fVar159 = auVar93._24_4_;
    auVar24._24_4_ = fVar159 * fVar326;
    auVar24._28_4_ = fStack_1e4;
    auVar20 = vsubps_avx(auVar24,auVar23);
    auVar93 = vperm2f128_avx(_local_a20,_local_a20,1);
    auVar93 = vshufps_avx(auVar93,_local_a20,0x30);
    auVar17 = vshufps_avx(_local_a20,auVar93,0x29);
    fVar352 = auVar17._0_4_;
    fVar354 = auVar17._4_4_;
    auVar25._4_4_ = fVar354 * fVar245;
    auVar25._0_4_ = fVar352 * fVar227;
    fVar261 = auVar17._8_4_;
    auVar25._8_4_ = fVar261 * fVar203;
    fVar263 = auVar17._12_4_;
    auVar25._12_4_ = fVar263 * fVar228;
    fVar265 = auVar17._16_4_;
    auVar25._16_4_ = fVar265 * fVar274;
    fVar267 = auVar17._20_4_;
    auVar25._20_4_ = fVar267 * fVar288;
    fVar269 = auVar17._24_4_;
    auVar25._24_4_ = fVar269 * fVar326;
    auVar25._28_4_ = auVar93._28_4_;
    auVar26._4_4_ = fVar328 * fVar247;
    auVar26._0_4_ = fVar321 * fVar180;
    auVar26._8_4_ = fVar331 * fVar204;
    auVar26._12_4_ = fVar334 * fVar230;
    auVar26._16_4_ = fVar337 * fVar279;
    auVar26._20_4_ = fVar340 * fVar291;
    uVar77 = auVar16._28_4_;
    auVar26._24_4_ = fVar343 * fVar329;
    auVar26._28_4_ = uVar77;
    auVar93 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar247 * fVar345;
    auVar27._0_4_ = fVar180 * fVar137;
    auVar27._8_4_ = fVar204 * fVar153;
    auVar27._12_4_ = fVar230 * fVar349;
    auVar27._16_4_ = fVar279 * fVar156;
    auVar27._20_4_ = fVar291 * fVar350;
    auVar27._24_4_ = fVar329 * fVar159;
    auVar27._28_4_ = uVar77;
    auVar28._4_4_ = fVar243 * fVar354;
    auVar28._0_4_ = fVar179 * fVar352;
    auVar28._8_4_ = fVar202 * fVar261;
    auVar28._12_4_ = fVar226 * fVar263;
    auVar28._16_4_ = fVar233 * fVar265;
    auVar28._20_4_ = fVar285 * fVar267;
    auVar28._24_4_ = fVar319 * fVar269;
    auVar28._28_4_ = fStack_1c4;
    auVar21 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ =
         fVar283 * (auVar307._4_4_ * auVar307._4_4_ +
                   auVar278._4_4_ * auVar278._4_4_ + auVar18._4_4_ * auVar18._4_4_);
    auVar29._0_4_ =
         fVar281 * (auVar307._0_4_ * auVar307._0_4_ +
                   auVar278._0_4_ * auVar278._0_4_ + auVar18._0_4_ * auVar18._0_4_);
    auVar29._8_4_ =
         fVar304 * (auVar307._8_4_ * auVar307._8_4_ +
                   auVar278._8_4_ * auVar278._8_4_ + auVar18._8_4_ * auVar18._8_4_);
    auVar29._12_4_ =
         fVar318 * (auVar307._12_4_ * auVar307._12_4_ +
                   auVar278._12_4_ * auVar278._12_4_ + auVar18._12_4_ * auVar18._12_4_);
    auVar29._16_4_ =
         fVar287 * (auVar307._16_4_ * auVar307._16_4_ +
                   auVar278._16_4_ * auVar278._16_4_ + auVar18._16_4_ * auVar18._16_4_);
    auVar29._20_4_ =
         fVar290 * (auVar307._20_4_ * auVar307._20_4_ +
                   auVar278._20_4_ * auVar278._20_4_ + auVar18._20_4_ * auVar18._20_4_);
    auVar29._24_4_ =
         fVar293 * (auVar307._24_4_ * auVar307._24_4_ +
                   auVar278._24_4_ * auVar278._24_4_ + auVar18._24_4_ * auVar18._24_4_);
    auVar29._28_4_ = auVar307._28_4_ + fVar161 + auVar18._28_4_;
    auVar30._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar93._4_4_ * auVar93._4_4_ + auVar21._4_4_ * auVar21._4_4_) * fVar283;
    auVar30._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar93._0_4_ * auVar93._0_4_ + auVar21._0_4_ * auVar21._0_4_) * fVar281;
    auVar30._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar93._8_4_ * auVar93._8_4_ + auVar21._8_4_ * auVar21._8_4_) * fVar304;
    auVar30._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar93._12_4_ * auVar93._12_4_ + auVar21._12_4_ * auVar21._12_4_) * fVar318;
    auVar30._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar93._16_4_ * auVar93._16_4_ + auVar21._16_4_ * auVar21._16_4_) * fVar287;
    auVar30._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar93._20_4_ * auVar93._20_4_ + auVar21._20_4_ * auVar21._20_4_) * fVar290;
    auVar30._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar93._24_4_ * auVar93._24_4_ + auVar21._24_4_ * auVar21._24_4_) * fVar293;
    auVar30._28_4_ = auVar120._28_4_ + auVar19._28_4_;
    auVar120 = vmaxps_avx(auVar29,auVar30);
    auVar93 = vperm2f128_avx(auVar218,auVar218,1);
    auVar93 = vshufps_avx(auVar93,auVar218,0x30);
    auVar16 = vshufps_avx(auVar218,auVar93,0x29);
    auVar121._0_4_ = auVar218._0_4_ + fVar229;
    auVar121._4_4_ = auVar218._4_4_ + fVar181;
    auVar121._8_4_ = auVar218._8_4_ + fVar200;
    auVar121._12_4_ = auVar218._12_4_ + fVar201;
    auVar121._16_4_ = auVar218._16_4_ + fVar206;
    auVar121._20_4_ = auVar218._20_4_ + fVar209;
    auVar121._24_4_ = auVar218._24_4_ + fVar231;
    auVar121._28_4_ = auVar218._28_4_ + fVar232;
    auVar93 = vmaxps_avx(auVar218,auVar121);
    auVar17 = vmaxps_avx(auVar14,auVar16);
    auVar93 = vmaxps_avx(auVar93,auVar17);
    auVar17 = vrsqrtps_avx(auVar176);
    fVar161 = auVar17._0_4_;
    fVar229 = auVar17._4_4_;
    fVar181 = auVar17._8_4_;
    fVar200 = auVar17._12_4_;
    fVar201 = auVar17._16_4_;
    fVar206 = auVar17._20_4_;
    fVar209 = auVar17._24_4_;
    auVar31._4_4_ = fVar229 * fVar229 * fVar229 * auVar176._4_4_ * 0.5;
    auVar31._0_4_ = fVar161 * fVar161 * fVar161 * auVar176._0_4_ * 0.5;
    auVar31._8_4_ = fVar181 * fVar181 * fVar181 * auVar176._8_4_ * 0.5;
    auVar31._12_4_ = fVar200 * fVar200 * fVar200 * auVar176._12_4_ * 0.5;
    auVar31._16_4_ = fVar201 * fVar201 * fVar201 * auVar176._16_4_ * 0.5;
    auVar31._20_4_ = fVar206 * fVar206 * fVar206 * auVar176._20_4_ * 0.5;
    auVar31._24_4_ = fVar209 * fVar209 * fVar209 * auVar176._24_4_ * 0.5;
    auVar31._28_4_ = auVar176._28_4_;
    auVar32._4_4_ = fVar229 * 1.5;
    auVar32._0_4_ = fVar161 * 1.5;
    auVar32._8_4_ = fVar181 * 1.5;
    auVar32._12_4_ = fVar200 * 1.5;
    auVar32._16_4_ = fVar201 * 1.5;
    auVar32._20_4_ = fVar206 * 1.5;
    auVar32._24_4_ = fVar209 * 1.5;
    auVar32._28_4_ = auVar17._28_4_;
    local_380 = vsubps_avx(auVar32,auVar31);
    auVar67._4_4_ = fVar280;
    auVar67._0_4_ = fVar275;
    auVar67._8_4_ = fVar282;
    auVar67._12_4_ = fVar284;
    auVar67._16_4_ = fVar286;
    auVar67._20_4_ = fVar289;
    auVar67._24_4_ = fVar292;
    auVar67._28_4_ = fVar294;
    auVar307 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a00 = vsubps_avx(auVar307,auVar67);
    auVar65._4_4_ = fVar151;
    auVar65._0_4_ = fVar136;
    auVar65._8_4_ = fVar152;
    auVar65._12_4_ = fVar154;
    auVar65._16_4_ = fVar155;
    auVar65._20_4_ = fVar157;
    auVar65._24_4_ = fVar158;
    auVar65._28_4_ = fVar160;
    local_9e0 = vsubps_avx(auVar307,auVar65);
    fVar295 = local_9e0._0_4_;
    fVar298 = local_9e0._4_4_;
    fVar299 = local_9e0._8_4_;
    fVar300 = local_9e0._12_4_;
    fVar301 = local_9e0._16_4_;
    fVar302 = local_9e0._20_4_;
    fVar303 = local_9e0._24_4_;
    fVar229 = local_a00._0_4_;
    fVar200 = local_a00._4_4_;
    fVar206 = local_a00._8_4_;
    fVar231 = local_a00._12_4_;
    fVar281 = local_a00._16_4_;
    fVar304 = local_a00._20_4_;
    fVar287 = local_a00._24_4_;
    auVar307 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar68);
    fVar358 = auVar307._0_4_;
    fVar361 = auVar307._4_4_;
    fVar363 = auVar307._8_4_;
    fVar364 = auVar307._12_4_;
    fVar365 = auVar307._16_4_;
    fVar366 = auVar307._20_4_;
    fVar367 = auVar307._24_4_;
    auVar277._0_4_ =
         fVar358 * (float)local_8e0._0_4_ +
         (float)local_6e0._0_4_ * fVar229 + fVar295 * (float)local_700._0_4_;
    auVar277._4_4_ =
         fVar361 * (float)local_8e0._4_4_ +
         (float)local_6e0._4_4_ * fVar200 + fVar298 * (float)local_700._4_4_;
    auVar277._8_4_ = fVar363 * fStack_8d8 + fStack_6d8 * fVar206 + fVar299 * fStack_6f8;
    auVar277._12_4_ = fVar364 * fStack_8d4 + fStack_6d4 * fVar231 + fVar300 * fStack_6f4;
    auVar277._16_4_ = fVar365 * fStack_8d0 + fStack_6d0 * fVar281 + fVar301 * fStack_6f0;
    auVar277._20_4_ = fVar366 * fStack_8cc + fStack_6cc * fVar304 + fVar302 * fStack_6ec;
    auVar277._24_4_ = fVar367 * fStack_8c8 + fStack_6c8 * fVar287 + fVar303 * fStack_6e8;
    auVar277._28_4_ = auVar21._28_4_ + auVar17._28_4_ + auVar176._28_4_;
    auVar324._0_4_ = fVar358 * fVar358 + fVar229 * fVar229 + fVar295 * fVar295;
    auVar324._4_4_ = fVar361 * fVar361 + fVar200 * fVar200 + fVar298 * fVar298;
    auVar324._8_4_ = fVar363 * fVar363 + fVar206 * fVar206 + fVar299 * fVar299;
    auVar324._12_4_ = fVar364 * fVar364 + fVar231 * fVar231 + fVar300 * fVar300;
    auVar324._16_4_ = fVar365 * fVar365 + fVar281 * fVar281 + fVar301 * fVar301;
    auVar324._20_4_ = fVar366 * fVar366 + fVar304 * fVar304 + fVar302 * fVar302;
    auVar324._24_4_ = fVar367 * fVar367 + fVar287 * fVar287 + fVar303 * fVar303;
    auVar324._28_4_ = fStack_1c4 + fStack_1c4 + auVar21._28_4_;
    fVar181 = local_380._0_4_;
    fVar201 = local_380._4_4_;
    fVar209 = local_380._8_4_;
    fVar232 = local_380._12_4_;
    fVar283 = local_380._16_4_;
    fVar318 = local_380._20_4_;
    fVar290 = local_380._24_4_;
    local_600 = (float)local_8e0._0_4_ * fVar180 * fVar181 +
                fVar179 * fVar181 * (float)local_6e0._0_4_ +
                fVar227 * fVar181 * (float)local_700._0_4_;
    fStack_5fc = (float)local_8e0._4_4_ * fVar247 * fVar201 +
                 fVar243 * fVar201 * (float)local_6e0._4_4_ +
                 fVar245 * fVar201 * (float)local_700._4_4_;
    fStack_5f8 = fStack_8d8 * fVar204 * fVar209 +
                 fVar202 * fVar209 * fStack_6d8 + fVar203 * fVar209 * fStack_6f8;
    fStack_5f4 = fStack_8d4 * fVar230 * fVar232 +
                 fVar226 * fVar232 * fStack_6d4 + fVar228 * fVar232 * fStack_6f4;
    fStack_5f0 = fStack_8d0 * fVar279 * fVar283 +
                 fVar233 * fVar283 * fStack_6d0 + fVar274 * fVar283 * fStack_6f0;
    fStack_5ec = fStack_8cc * fVar291 * fVar318 +
                 fVar285 * fVar318 * fStack_6cc + fVar288 * fVar318 * fStack_6ec;
    fStack_5e8 = fStack_8c8 * fVar329 * fVar290 +
                 fVar319 * fVar290 * fStack_6c8 + fVar326 * fVar290 * fStack_6e8;
    fVar161 = fStack_8c4 + fStack_6c4 + fStack_6e4;
    local_620._0_4_ =
         fVar358 * fVar180 * fVar181 + fVar179 * fVar181 * fVar229 + fVar295 * fVar227 * fVar181;
    local_620._4_4_ =
         fVar361 * fVar247 * fVar201 + fVar243 * fVar201 * fVar200 + fVar298 * fVar245 * fVar201;
    local_620._8_4_ =
         fVar363 * fVar204 * fVar209 + fVar202 * fVar209 * fVar206 + fVar299 * fVar203 * fVar209;
    local_620._12_4_ =
         fVar364 * fVar230 * fVar232 + fVar226 * fVar232 * fVar231 + fVar300 * fVar228 * fVar232;
    local_620._16_4_ =
         fVar365 * fVar279 * fVar283 + fVar233 * fVar283 * fVar281 + fVar301 * fVar274 * fVar283;
    local_620._20_4_ =
         fVar366 * fVar291 * fVar318 + fVar285 * fVar318 * fVar304 + fVar302 * fVar288 * fVar318;
    local_620._24_4_ =
         fVar367 * fVar329 * fVar290 + fVar319 * fVar290 * fVar287 + fVar303 * fVar326 * fVar290;
    local_620._28_4_ = fStack_6c4 + fVar161;
    auVar33._4_4_ = fStack_5fc * local_620._4_4_;
    auVar33._0_4_ = local_600 * local_620._0_4_;
    auVar33._8_4_ = fStack_5f8 * local_620._8_4_;
    auVar33._12_4_ = fStack_5f4 * local_620._12_4_;
    auVar33._16_4_ = fStack_5f0 * local_620._16_4_;
    auVar33._20_4_ = fStack_5ec * local_620._20_4_;
    auVar33._24_4_ = fStack_5e8 * local_620._24_4_;
    auVar33._28_4_ = fVar161;
    auVar17 = vsubps_avx(auVar277,auVar33);
    auVar34._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar34._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar34._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar34._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar34._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar34._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar34._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar34._28_4_ = fStack_6c4;
    local_660 = vsubps_avx(auVar324,auVar34);
    local_6c0 = vsqrtps_avx(auVar120);
    fVar161 = (local_6c0._0_4_ + auVar93._0_4_) * 1.0000002;
    fVar293 = (local_6c0._4_4_ + auVar93._4_4_) * 1.0000002;
    fVar332 = (local_6c0._8_4_ + auVar93._8_4_) * 1.0000002;
    fVar134 = (local_6c0._12_4_ + auVar93._12_4_) * 1.0000002;
    fVar335 = (local_6c0._16_4_ + auVar93._16_4_) * 1.0000002;
    fVar338 = (local_6c0._20_4_ + auVar93._20_4_) * 1.0000002;
    fVar341 = (local_6c0._24_4_ + auVar93._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar293 * fVar293;
    auVar35._0_4_ = fVar161 * fVar161;
    auVar35._8_4_ = fVar332 * fVar332;
    auVar35._12_4_ = fVar134 * fVar134;
    auVar35._16_4_ = fVar335 * fVar335;
    auVar35._20_4_ = fVar338 * fVar338;
    auVar35._24_4_ = fVar341 * fVar341;
    auVar35._28_4_ = local_6c0._28_4_ + auVar93._28_4_;
    local_3c0._0_4_ = auVar17._0_4_ + auVar17._0_4_;
    local_3c0._4_4_ = auVar17._4_4_ + auVar17._4_4_;
    local_3c0._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    local_3c0._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    local_3c0._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    local_3c0._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    local_3c0._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar161 = auVar17._28_4_;
    local_3c0._28_4_ = fVar161 + fVar161;
    auVar93 = vsubps_avx(local_660,auVar35);
    auVar36._4_4_ = fStack_5fc * fStack_5fc;
    auVar36._0_4_ = local_600 * local_600;
    auVar36._8_4_ = fStack_5f8 * fStack_5f8;
    auVar36._12_4_ = fStack_5f4 * fStack_5f4;
    auVar36._16_4_ = fStack_5f0 * fStack_5f0;
    auVar36._20_4_ = fStack_5ec * fStack_5ec;
    auVar36._24_4_ = fStack_5e8 * fStack_5e8;
    auVar36._28_4_ = fVar161;
    auVar17 = vsubps_avx(local_260,auVar36);
    local_680._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    local_680._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    local_680._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    local_680._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    local_680._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    local_680._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    local_680._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    local_680._28_4_ = local_260._28_4_;
    fVar161 = auVar17._0_4_;
    local_6a0._0_4_ = fVar161 * 4.0;
    fVar293 = auVar17._4_4_;
    local_6a0._4_4_ = fVar293 * 4.0;
    fVar332 = auVar17._8_4_;
    fStack_698 = fVar332 * 4.0;
    fVar134 = auVar17._12_4_;
    fStack_694 = fVar134 * 4.0;
    fVar335 = auVar17._16_4_;
    fStack_690 = fVar335 * 4.0;
    fVar338 = auVar17._20_4_;
    fStack_68c = fVar338 * 4.0;
    fVar341 = auVar17._24_4_;
    fStack_688 = fVar341 * 4.0;
    uStack_684 = 0x40800000;
    auVar37._4_4_ = auVar93._4_4_ * (float)local_6a0._4_4_;
    auVar37._0_4_ = auVar93._0_4_ * (float)local_6a0._0_4_;
    auVar37._8_4_ = auVar93._8_4_ * fStack_698;
    auVar37._12_4_ = auVar93._12_4_ * fStack_694;
    auVar37._16_4_ = auVar93._16_4_ * fStack_690;
    auVar37._20_4_ = auVar93._20_4_ * fStack_68c;
    auVar37._24_4_ = auVar93._24_4_ * fStack_688;
    auVar37._28_4_ = 0x40800000;
    auVar307 = vsubps_avx(local_680,auVar37);
    auVar120 = vcmpps_avx(auVar307,ZEXT832(0) << 0x20,5);
    auVar94._8_4_ = 0x7fffffff;
    auVar94._0_8_ = 0x7fffffff7fffffff;
    auVar94._12_4_ = 0x7fffffff;
    auVar94._16_4_ = 0x7fffffff;
    auVar94._20_4_ = 0x7fffffff;
    auVar94._24_4_ = 0x7fffffff;
    auVar94._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar36,auVar94);
    local_2e0._0_4_ = fVar161 + fVar161;
    local_2e0._4_4_ = fVar293 + fVar293;
    local_2e0._8_4_ = fVar332 + fVar332;
    local_2e0._12_4_ = fVar134 + fVar134;
    local_2e0._16_4_ = fVar335 + fVar335;
    local_2e0._20_4_ = fVar338 + fVar338;
    local_2e0._24_4_ = fVar341 + fVar341;
    local_2e0._28_4_ = auVar17._28_4_ + auVar17._28_4_;
    local_2c0 = vandps_avx(auVar17,auVar94);
    uVar76 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_a80._0_8_ = uVar76 ^ 0x8000000080000000;
    local_a80._8_4_ = -local_3c0._8_4_;
    local_a80._12_4_ = -local_3c0._12_4_;
    local_a80._16_4_ = -local_3c0._16_4_;
    local_a80._20_4_ = -local_3c0._20_4_;
    local_a80._24_4_ = -local_3c0._24_4_;
    local_a80._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0x7f,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar120 >> 0xbf,0) == '\0') &&
        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar120[0x1f])
    {
      auVar360._8_4_ = 0x7f800000;
      auVar360._0_8_ = 0x7f8000007f800000;
      auVar360._12_4_ = 0x7f800000;
      auVar360._16_4_ = 0x7f800000;
      auVar360._20_4_ = 0x7f800000;
      auVar360._24_4_ = 0x7f800000;
      auVar360._28_4_ = 0x7f800000;
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
    }
    else {
      auVar278 = vsqrtps_avx(auVar307);
      auVar18 = vrcpps_avx(local_2e0);
      auVar17 = vcmpps_avx(auVar307,ZEXT832(0) << 0x20,5);
      fVar161 = auVar18._0_4_;
      fVar293 = auVar18._4_4_;
      auVar38._4_4_ = local_2e0._4_4_ * fVar293;
      auVar38._0_4_ = local_2e0._0_4_ * fVar161;
      fVar332 = auVar18._8_4_;
      auVar38._8_4_ = local_2e0._8_4_ * fVar332;
      fVar134 = auVar18._12_4_;
      auVar38._12_4_ = local_2e0._12_4_ * fVar134;
      fVar335 = auVar18._16_4_;
      auVar38._16_4_ = local_2e0._16_4_ * fVar335;
      fVar338 = auVar18._20_4_;
      auVar38._20_4_ = local_2e0._20_4_ * fVar338;
      fVar341 = auVar18._24_4_;
      auVar38._24_4_ = local_2e0._24_4_ * fVar341;
      auVar38._28_4_ = auVar307._28_4_;
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar307 = vsubps_avx(auVar95,auVar38);
      fVar161 = fVar161 + fVar161 * auVar307._0_4_;
      fVar293 = fVar293 + fVar293 * auVar307._4_4_;
      fVar332 = fVar332 + fVar332 * auVar307._8_4_;
      fVar134 = fVar134 + fVar134 * auVar307._12_4_;
      fVar335 = fVar335 + fVar335 * auVar307._16_4_;
      fVar338 = fVar338 + fVar338 * auVar307._20_4_;
      fVar341 = fVar341 + fVar341 * auVar307._24_4_;
      auVar19 = vsubps_avx(local_a80,auVar278);
      fVar235 = auVar19._0_4_ * fVar161;
      fVar244 = auVar19._4_4_ * fVar293;
      auVar39._4_4_ = fVar244;
      auVar39._0_4_ = fVar235;
      fVar246 = auVar19._8_4_ * fVar332;
      auVar39._8_4_ = fVar246;
      fVar248 = auVar19._12_4_ * fVar134;
      auVar39._12_4_ = fVar248;
      fVar249 = auVar19._16_4_ * fVar335;
      auVar39._16_4_ = fVar249;
      fVar250 = auVar19._20_4_ * fVar338;
      auVar39._20_4_ = fVar250;
      fVar251 = auVar19._24_4_ * fVar341;
      auVar39._24_4_ = fVar251;
      auVar39._28_4_ = auVar19._28_4_;
      auVar278 = vsubps_avx(auVar278,local_3c0);
      fVar161 = auVar278._0_4_ * fVar161;
      fVar293 = auVar278._4_4_ * fVar293;
      auVar40._4_4_ = fVar293;
      auVar40._0_4_ = fVar161;
      fVar332 = auVar278._8_4_ * fVar332;
      auVar40._8_4_ = fVar332;
      fVar134 = auVar278._12_4_ * fVar134;
      auVar40._12_4_ = fVar134;
      fVar335 = auVar278._16_4_ * fVar335;
      auVar40._16_4_ = fVar335;
      fVar338 = auVar278._20_4_ * fVar338;
      auVar40._20_4_ = fVar338;
      fVar341 = auVar278._24_4_ * fVar341;
      auVar40._24_4_ = fVar341;
      auVar40._28_4_ = auVar18._28_4_ + auVar307._28_4_;
      fStack_344 = local_620._28_4_ + auVar278._28_4_;
      local_360 = fVar181 * (local_620._0_4_ + local_600 * fVar235);
      fStack_35c = fVar201 * (local_620._4_4_ + fStack_5fc * fVar244);
      fStack_358 = fVar209 * (local_620._8_4_ + fStack_5f8 * fVar246);
      fStack_354 = fVar232 * (local_620._12_4_ + fStack_5f4 * fVar248);
      fStack_350 = fVar283 * (local_620._16_4_ + fStack_5f0 * fVar249);
      fStack_34c = fVar318 * (local_620._20_4_ + fStack_5ec * fVar250);
      fStack_348 = fVar290 * (local_620._24_4_ + fStack_5e8 * fVar251);
      local_340 = fVar181 * (local_620._0_4_ + local_600 * fVar161);
      fStack_33c = fVar201 * (local_620._4_4_ + fStack_5fc * fVar293);
      fStack_338 = fVar209 * (local_620._8_4_ + fStack_5f8 * fVar332);
      fStack_334 = fVar232 * (local_620._12_4_ + fStack_5f4 * fVar134);
      fStack_330 = fVar283 * (local_620._16_4_ + fStack_5f0 * fVar335);
      fStack_32c = fVar318 * (local_620._20_4_ + fStack_5ec * fVar338);
      fStack_328 = fVar290 * (local_620._24_4_ + fStack_5e8 * fVar341);
      fStack_324 = local_620._28_4_ + fStack_344;
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar360 = vblendvps_avx(auVar219,auVar39,auVar17);
      auVar220._8_4_ = 0xff800000;
      auVar220._0_8_ = 0xff800000ff800000;
      auVar220._12_4_ = 0xff800000;
      auVar220._16_4_ = 0xff800000;
      auVar220._20_4_ = 0xff800000;
      auVar220._24_4_ = 0xff800000;
      auVar220._28_4_ = 0xff800000;
      auVar122 = vblendvps_avx(auVar220,auVar40,auVar17);
      auVar307 = vmaxps_avx(local_5e0,local_3a0);
      auVar41._4_4_ = auVar307._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar307._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar307._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar307._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar307._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar307._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar307._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar307._28_4_;
      auVar307 = vcmpps_avx(local_2c0,auVar41,1);
      auVar18 = auVar17 & auVar307;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar307,auVar17);
        auVar167 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
        auVar307 = vcmpps_avx(auVar93,_DAT_01f7b000,2);
        auVar258._8_4_ = 0xff800000;
        auVar258._0_8_ = 0xff800000ff800000;
        auVar258._12_4_ = 0xff800000;
        auVar258._16_4_ = 0xff800000;
        auVar258._20_4_ = 0xff800000;
        auVar258._24_4_ = 0xff800000;
        auVar258._28_4_ = 0xff800000;
        auVar259._8_4_ = 0x7f800000;
        auVar259._0_8_ = 0x7f8000007f800000;
        auVar259._12_4_ = 0x7f800000;
        auVar259._16_4_ = 0x7f800000;
        auVar259._20_4_ = 0x7f800000;
        auVar259._24_4_ = 0x7f800000;
        auVar259._28_4_ = 0x7f800000;
        auVar93 = vblendvps_avx(auVar259,auVar258,auVar307);
        auVar80 = vpmovsxwd_avx(auVar167);
        auVar167 = vpunpckhwd_avx(auVar167,auVar167);
        auVar224._16_16_ = auVar167;
        auVar224._0_16_ = auVar80;
        auVar360 = vblendvps_avx(auVar360,auVar93,auVar224);
        auVar93 = vblendvps_avx(auVar258,auVar259,auVar307);
        auVar122 = vblendvps_avx(auVar122,auVar93,auVar224);
        auVar199._0_8_ = auVar120._0_8_ ^ 0xffffffffffffffff;
        auVar199._8_4_ = auVar120._8_4_ ^ 0xffffffff;
        auVar199._12_4_ = auVar120._12_4_ ^ 0xffffffff;
        auVar199._16_4_ = auVar120._16_4_ ^ 0xffffffff;
        auVar199._20_4_ = auVar120._20_4_ ^ 0xffffffff;
        auVar199._24_4_ = auVar120._24_4_ ^ 0xffffffff;
        auVar199._28_4_ = auVar120._28_4_ ^ 0xffffffff;
        auVar120 = vorps_avx(auVar307,auVar199);
        auVar120 = vandps_avx(auVar17,auVar120);
      }
    }
    auVar273 = ZEXT3264(local_620);
    auVar311 = ZEXT3264(local_3a0);
    auVar93 = local_5c0 & auVar120;
    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar93 >> 0x7f,0) != '\0') ||
          (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar93 >> 0xbf,0) != '\0') ||
        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar93[0x1f] < '\0')
    {
      fStack_5e4 = fStack_8c4 + fStack_6c4 + fStack_6e4;
      auVar96 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_3e0 = auVar96;
      auVar167 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_950._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar221._16_16_ = auVar167;
      auVar221._0_16_ = auVar167;
      auVar18 = vminps_avx(auVar221,auVar122);
      auVar97._0_4_ =
           (float)local_8e0._0_4_ * fVar351 +
           (float)local_6e0._0_4_ * fVar305 + (float)local_700._0_4_ * fVar320;
      auVar97._4_4_ =
           (float)local_8e0._4_4_ * fVar353 +
           (float)local_6e0._4_4_ * fVar312 + (float)local_700._4_4_ * fVar327;
      auVar97._8_4_ = fStack_8d8 * fVar260 + fStack_6d8 * fVar313 + fStack_6f8 * fVar330;
      auVar97._12_4_ = fStack_8d4 * fVar262 + fStack_6d4 * fVar314 + fStack_6f4 * fVar333;
      auVar97._16_4_ = fStack_8d0 * fVar264 + fStack_6d0 * fVar315 + fStack_6f0 * fVar336;
      auVar97._20_4_ = fStack_8cc * fVar266 + fStack_6cc * fVar316 + fStack_6ec * fVar339;
      auVar97._24_4_ = fStack_8c8 * fVar268 + fStack_6c8 * fVar317 + fStack_6e8 * fVar342;
      auVar97._28_4_ = fVar344 + fStack_1e4 + fVar344;
      auVar307 = vrcpps_avx(auVar97);
      fVar161 = auVar307._0_4_;
      fVar293 = auVar307._4_4_;
      auVar42._4_4_ = auVar97._4_4_ * fVar293;
      auVar42._0_4_ = auVar97._0_4_ * fVar161;
      fVar332 = auVar307._8_4_;
      auVar42._8_4_ = auVar97._8_4_ * fVar332;
      fVar134 = auVar307._12_4_;
      auVar42._12_4_ = auVar97._12_4_ * fVar134;
      fVar335 = auVar307._16_4_;
      auVar42._16_4_ = auVar97._16_4_ * fVar335;
      fVar338 = auVar307._20_4_;
      auVar42._20_4_ = auVar97._20_4_ * fVar338;
      fVar341 = auVar307._24_4_;
      auVar42._24_4_ = auVar97._24_4_ * fVar341;
      auVar42._28_4_ = local_a80._28_4_ + auVar167._12_4_;
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      auVar270._16_4_ = 0x3f800000;
      auVar270._20_4_ = 0x3f800000;
      auVar270._24_4_ = 0x3f800000;
      auVar270._28_4_ = 0x3f800000;
      auVar278 = vsubps_avx(auVar270,auVar42);
      auVar256._8_4_ = 0x7fffffff;
      auVar256._0_8_ = 0x7fffffff7fffffff;
      auVar256._12_4_ = 0x7fffffff;
      auVar256._16_4_ = 0x7fffffff;
      auVar256._20_4_ = 0x7fffffff;
      auVar256._24_4_ = 0x7fffffff;
      auVar256._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(auVar97,auVar256);
      auVar356._8_4_ = 0x219392ef;
      auVar356._0_8_ = 0x219392ef219392ef;
      auVar356._12_4_ = 0x219392ef;
      auVar356._16_4_ = 0x219392ef;
      auVar356._20_4_ = 0x219392ef;
      auVar356._24_4_ = 0x219392ef;
      auVar356._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar93,auVar356,1);
      auVar43._4_4_ =
           (fVar293 + fVar293 * auVar278._4_4_) *
           -(fVar353 * fVar361 + fVar312 * fVar200 + fVar327 * fVar298);
      auVar43._0_4_ =
           (fVar161 + fVar161 * auVar278._0_4_) *
           -(fVar351 * fVar358 + fVar305 * fVar229 + fVar320 * fVar295);
      auVar43._8_4_ =
           (fVar332 + fVar332 * auVar278._8_4_) *
           -(fVar260 * fVar363 + fVar313 * fVar206 + fVar330 * fVar299);
      auVar43._12_4_ =
           (fVar134 + fVar134 * auVar278._12_4_) *
           -(fVar262 * fVar364 + fVar314 * fVar231 + fVar333 * fVar300);
      auVar43._16_4_ =
           (fVar335 + fVar335 * auVar278._16_4_) *
           -(fVar264 * fVar365 + fVar315 * fVar281 + fVar336 * fVar301);
      auVar43._20_4_ =
           (fVar338 + fVar338 * auVar278._20_4_) *
           -(fVar266 * fVar366 + fVar316 * fVar304 + fVar339 * fVar302);
      auVar43._24_4_ =
           (fVar341 + fVar341 * auVar278._24_4_) *
           -(fVar268 * fVar367 + fVar317 * fVar287 + fVar342 * fVar303);
      auVar43._28_4_ = auVar307._28_4_ + auVar278._28_4_;
      auVar167 = ZEXT816(0) << 0x40;
      auVar93 = vcmpps_avx(auVar97,ZEXT1632(auVar167),1);
      auVar93 = vorps_avx(auVar17,auVar93);
      auVar325._8_4_ = 0xff800000;
      auVar325._0_8_ = 0xff800000ff800000;
      auVar325._12_4_ = 0xff800000;
      auVar325._16_4_ = 0xff800000;
      auVar325._20_4_ = 0xff800000;
      auVar325._24_4_ = 0xff800000;
      auVar325._28_4_ = 0xff800000;
      auVar93 = vblendvps_avx(auVar43,auVar325,auVar93);
      auVar307 = vcmpps_avx(auVar97,ZEXT1632(auVar167),6);
      auVar17 = vorps_avx(auVar17,auVar307);
      auVar348._8_4_ = 0x7f800000;
      auVar348._0_8_ = 0x7f8000007f800000;
      auVar348._12_4_ = 0x7f800000;
      auVar348._16_4_ = 0x7f800000;
      auVar348._20_4_ = 0x7f800000;
      auVar348._24_4_ = 0x7f800000;
      auVar348._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar43,auVar348,auVar17);
      auVar307 = vmaxps_avx(local_320,auVar360);
      auVar307 = vmaxps_avx(auVar307,auVar93);
      auVar18 = vminps_avx(auVar18,auVar17);
      auVar273 = ZEXT3264(auVar18);
      auVar278 = ZEXT1632(auVar167);
      auVar93 = vsubps_avx(auVar278,auVar12);
      auVar17 = vsubps_avx(auVar278,auVar13);
      auVar44._4_4_ = auVar17._4_4_ * -fVar328;
      auVar44._0_4_ = auVar17._0_4_ * -fVar321;
      auVar44._8_4_ = auVar17._8_4_ * -fVar331;
      auVar44._12_4_ = auVar17._12_4_ * -fVar334;
      auVar44._16_4_ = auVar17._16_4_ * -fVar337;
      auVar44._20_4_ = auVar17._20_4_ * -fVar340;
      auVar44._24_4_ = auVar17._24_4_ * -fVar343;
      auVar44._28_4_ = auVar17._28_4_;
      auVar45._4_4_ = fVar345 * auVar93._4_4_;
      auVar45._0_4_ = fVar137 * auVar93._0_4_;
      auVar45._8_4_ = fVar153 * auVar93._8_4_;
      auVar45._12_4_ = fVar349 * auVar93._12_4_;
      auVar45._16_4_ = fVar156 * auVar93._16_4_;
      auVar45._20_4_ = fVar350 * auVar93._20_4_;
      auVar45._24_4_ = fVar159 * auVar93._24_4_;
      auVar45._28_4_ = auVar93._28_4_;
      auVar93 = vsubps_avx(auVar44,auVar45);
      auVar17 = vsubps_avx(auVar278,auVar15);
      auVar46._4_4_ = fVar354 * auVar17._4_4_;
      auVar46._0_4_ = fVar352 * auVar17._0_4_;
      auVar46._8_4_ = fVar261 * auVar17._8_4_;
      auVar46._12_4_ = fVar263 * auVar17._12_4_;
      auVar46._16_4_ = fVar265 * auVar17._16_4_;
      auVar46._20_4_ = fVar267 * auVar17._20_4_;
      uVar1 = auVar17._28_4_;
      auVar46._24_4_ = fVar269 * auVar17._24_4_;
      auVar46._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar93,auVar46);
      auVar47._4_4_ = (float)local_700._4_4_ * -fVar328;
      auVar47._0_4_ = (float)local_700._0_4_ * -fVar321;
      auVar47._8_4_ = fStack_6f8 * -fVar331;
      auVar47._12_4_ = fStack_6f4 * -fVar334;
      auVar47._16_4_ = fStack_6f0 * -fVar337;
      auVar47._20_4_ = fStack_6ec * -fVar340;
      auVar47._24_4_ = fStack_6e8 * -fVar343;
      auVar47._28_4_ = uVar77 ^ 0x80000000;
      auVar308._8_4_ = 0x3f800000;
      auVar308._0_8_ = 0x3f8000003f800000;
      auVar308._12_4_ = 0x3f800000;
      auVar308._16_4_ = 0x3f800000;
      auVar308._20_4_ = 0x3f800000;
      auVar308._24_4_ = 0x3f800000;
      auVar308._28_4_ = 0x3f800000;
      auVar311 = ZEXT3264(auVar308);
      auVar48._4_4_ = (float)local_6e0._4_4_ * fVar345;
      auVar48._0_4_ = (float)local_6e0._0_4_ * fVar137;
      auVar48._8_4_ = fStack_6d8 * fVar153;
      auVar48._12_4_ = fStack_6d4 * fVar349;
      auVar48._16_4_ = fStack_6d0 * fVar156;
      auVar48._20_4_ = fStack_6cc * fVar350;
      auVar48._24_4_ = fStack_6c8 * fVar159;
      auVar48._28_4_ = uVar1;
      auVar93 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = (float)local_8e0._4_4_ * fVar354;
      auVar49._0_4_ = (float)local_8e0._0_4_ * fVar352;
      auVar49._8_4_ = fStack_8d8 * fVar261;
      auVar49._12_4_ = fStack_8d4 * fVar263;
      auVar49._16_4_ = fStack_8d0 * fVar265;
      auVar49._20_4_ = fStack_8cc * fVar267;
      auVar49._24_4_ = fStack_8c8 * fVar269;
      auVar49._28_4_ = uVar1;
      auVar13 = vsubps_avx(auVar93,auVar49);
      auVar93 = vrcpps_avx(auVar13);
      fVar161 = auVar93._0_4_;
      fVar229 = auVar93._4_4_;
      auVar50._4_4_ = auVar13._4_4_ * fVar229;
      auVar50._0_4_ = auVar13._0_4_ * fVar161;
      fVar200 = auVar93._8_4_;
      auVar50._8_4_ = auVar13._8_4_ * fVar200;
      fVar206 = auVar93._12_4_;
      auVar50._12_4_ = auVar13._12_4_ * fVar206;
      fVar231 = auVar93._16_4_;
      auVar50._16_4_ = auVar13._16_4_ * fVar231;
      fVar281 = auVar93._20_4_;
      auVar50._20_4_ = auVar13._20_4_ * fVar281;
      fVar304 = auVar93._24_4_;
      auVar50._24_4_ = auVar13._24_4_ * fVar304;
      auVar50._28_4_ = fStack_8c4;
      auVar278 = vsubps_avx(auVar308,auVar50);
      auVar93 = vandps_avx(auVar13,auVar256);
      auVar98._8_4_ = 0x219392ef;
      auVar98._0_8_ = 0x219392ef219392ef;
      auVar98._12_4_ = 0x219392ef;
      auVar98._16_4_ = 0x219392ef;
      auVar98._20_4_ = 0x219392ef;
      auVar98._24_4_ = 0x219392ef;
      auVar98._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar93,auVar98,1);
      auVar51._4_4_ = (fVar229 + fVar229 * auVar278._4_4_) * -auVar12._4_4_;
      auVar51._0_4_ = (fVar161 + fVar161 * auVar278._0_4_) * -auVar12._0_4_;
      auVar51._8_4_ = (fVar200 + fVar200 * auVar278._8_4_) * -auVar12._8_4_;
      auVar51._12_4_ = (fVar206 + fVar206 * auVar278._12_4_) * -auVar12._12_4_;
      auVar51._16_4_ = (fVar231 + fVar231 * auVar278._16_4_) * -auVar12._16_4_;
      auVar51._20_4_ = (fVar281 + fVar281 * auVar278._20_4_) * -auVar12._20_4_;
      auVar51._24_4_ = (fVar304 + fVar304 * auVar278._24_4_) * -auVar12._24_4_;
      auVar51._28_4_ = auVar12._28_4_ ^ 0x80000000;
      auVar93 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,1);
      auVar93 = vorps_avx(auVar17,auVar93);
      auVar93 = vblendvps_avx(auVar51,auVar325,auVar93);
      local_900 = vmaxps_avx(auVar307,auVar93);
      auVar93 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,6);
      auVar93 = vorps_avx(auVar17,auVar93);
      auVar93 = vblendvps_avx(auVar51,auVar348,auVar93);
      auVar120 = vandps_avx(auVar120,local_5c0);
      local_400 = vminps_avx(auVar18,auVar93);
      auVar93 = vcmpps_avx(local_900,local_400,2);
      auVar17 = auVar120 & auVar93;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar17 = vminps_avx(auVar218,auVar121);
        auVar12 = vminps_avx(auVar14,auVar16);
        auVar17 = vminps_avx(auVar17,auVar12);
        auVar17 = vsubps_avx(auVar17,local_6c0);
        auVar120 = vandps_avx(auVar93,auVar120);
        auVar69._4_4_ = fStack_35c;
        auVar69._0_4_ = local_360;
        auVar69._8_4_ = fStack_358;
        auVar69._12_4_ = fStack_354;
        auVar69._16_4_ = fStack_350;
        auVar69._20_4_ = fStack_34c;
        auVar69._24_4_ = fStack_348;
        auVar69._28_4_ = fStack_344;
        auVar93 = vminps_avx(auVar69,auVar308);
        auVar192 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar205 + fVar225 * (auVar93._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar207 + fVar234 * (auVar93._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar359 + fVar135 * (auVar93._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar362 + fVar182 * (auVar93._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar205 + fVar225 * (auVar93._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar207 + fVar234 * (auVar93._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar359 + fVar135 * (auVar93._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar362 + auVar93._28_4_ + 7.0;
        auVar70._4_4_ = fStack_33c;
        auVar70._0_4_ = local_340;
        auVar70._8_4_ = fStack_338;
        auVar70._12_4_ = fStack_334;
        auVar70._16_4_ = fStack_330;
        auVar70._20_4_ = fStack_32c;
        auVar70._24_4_ = fStack_328;
        auVar70._28_4_ = fStack_324;
        auVar93 = vminps_avx(auVar70,auVar308);
        auVar93 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar205 + fVar225 * (auVar93._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar207 + fVar234 * (auVar93._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar359 + fVar135 * (auVar93._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar362 + fVar182 * (auVar93._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar205 + fVar225 * (auVar93._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar207 + fVar234 * (auVar93._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar359 + fVar135 * (auVar93._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar362 + auVar93._28_4_ + 7.0;
        auVar52._4_4_ = auVar17._4_4_ * 0.99999976;
        auVar52._0_4_ = auVar17._0_4_ * 0.99999976;
        auVar52._8_4_ = auVar17._8_4_ * 0.99999976;
        auVar52._12_4_ = auVar17._12_4_ * 0.99999976;
        auVar52._16_4_ = auVar17._16_4_ * 0.99999976;
        auVar52._20_4_ = auVar17._20_4_ * 0.99999976;
        auVar52._24_4_ = auVar17._24_4_ * 0.99999976;
        auVar52._28_4_ = 0x3f7ffffc;
        auVar93 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
        auVar53._4_4_ = auVar93._4_4_ * auVar93._4_4_;
        auVar53._0_4_ = auVar93._0_4_ * auVar93._0_4_;
        auVar53._8_4_ = auVar93._8_4_ * auVar93._8_4_;
        auVar53._12_4_ = auVar93._12_4_ * auVar93._12_4_;
        auVar53._16_4_ = auVar93._16_4_ * auVar93._16_4_;
        auVar53._20_4_ = auVar93._20_4_ * auVar93._20_4_;
        auVar53._24_4_ = auVar93._24_4_ * auVar93._24_4_;
        auVar53._28_4_ = auVar93._28_4_;
        local_980 = vsubps_avx(local_660,auVar53);
        auVar54._4_4_ = local_980._4_4_ * (float)local_6a0._4_4_;
        auVar54._0_4_ = local_980._0_4_ * (float)local_6a0._0_4_;
        auVar54._8_4_ = local_980._8_4_ * fStack_698;
        auVar54._12_4_ = local_980._12_4_ * fStack_694;
        auVar54._16_4_ = local_980._16_4_ * fStack_690;
        auVar54._20_4_ = local_980._20_4_ * fStack_68c;
        auVar54._24_4_ = local_980._24_4_ * fStack_688;
        auVar54._28_4_ = auVar93._28_4_;
        auVar17 = vsubps_avx(local_680,auVar54);
        auVar93 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0x7f,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar93 >> 0xbf,0) == '\0') &&
            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar93[0x1f]) {
          auVar255 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar240 = ZEXT828(0) << 0x20;
          auVar217 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_a60 = ZEXT832(0) << 0x20;
          auVar271._8_4_ = 0x7f800000;
          auVar271._0_8_ = 0x7f8000007f800000;
          auVar271._12_4_ = 0x7f800000;
          auVar271._16_4_ = 0x7f800000;
          auVar271._20_4_ = 0x7f800000;
          auVar271._24_4_ = 0x7f800000;
          auVar271._28_4_ = 0x7f800000;
          auVar309._8_4_ = 0xff800000;
          auVar309._0_8_ = 0xff800000ff800000;
          auVar309._12_4_ = 0xff800000;
          auVar309._16_4_ = 0xff800000;
          auVar309._20_4_ = 0xff800000;
          auVar309._24_4_ = 0xff800000;
          auVar309._28_4_ = 0xff800000;
          auVar9 = local_980;
          fVar161 = 0.0;
          fVar225 = 0.0;
          fVar179 = 0.0;
          fVar227 = 0.0;
          fVar180 = 0.0;
          fVar229 = 0.0;
          fVar181 = 0.0;
          fVar234 = 0.0;
          local_980 = auVar15;
        }
        else {
          auVar12 = vrcpps_avx(local_2e0);
          fVar161 = auVar12._0_4_;
          auVar194._0_4_ = local_2e0._0_4_ * fVar161;
          fVar225 = auVar12._4_4_;
          auVar194._4_4_ = local_2e0._4_4_ * fVar225;
          fVar229 = auVar12._8_4_;
          auVar194._8_4_ = local_2e0._8_4_ * fVar229;
          fVar234 = auVar12._12_4_;
          auVar194._12_4_ = local_2e0._12_4_ * fVar234;
          fVar200 = auVar12._16_4_;
          auVar194._16_4_ = local_2e0._16_4_ * fVar200;
          fVar135 = auVar12._20_4_;
          auVar194._20_4_ = local_2e0._20_4_ * fVar135;
          fVar206 = auVar12._24_4_;
          auVar194._24_4_ = local_2e0._24_4_ * fVar206;
          auVar194._28_4_ = 0;
          auVar14 = vsubps_avx(auVar308,auVar194);
          auVar13 = vsqrtps_avx(auVar17);
          fVar161 = fVar161 + fVar161 * auVar14._0_4_;
          fVar225 = fVar225 + fVar225 * auVar14._4_4_;
          fVar229 = fVar229 + fVar229 * auVar14._8_4_;
          fVar234 = fVar234 + fVar234 * auVar14._12_4_;
          fVar200 = fVar200 + fVar200 * auVar14._16_4_;
          fVar135 = fVar135 + fVar135 * auVar14._20_4_;
          fVar206 = fVar206 + fVar206 * auVar14._24_4_;
          auVar15 = vsubps_avx(local_a80,auVar13);
          fVar359 = auVar15._0_4_ * fVar161;
          fVar362 = auVar15._4_4_ * fVar225;
          auVar55._4_4_ = fVar362;
          auVar55._0_4_ = fVar359;
          fVar293 = auVar15._8_4_ * fVar229;
          auVar55._8_4_ = fVar293;
          fVar332 = auVar15._12_4_ * fVar234;
          auVar55._12_4_ = fVar332;
          fVar134 = auVar15._16_4_ * fVar200;
          auVar55._16_4_ = fVar134;
          fVar335 = auVar15._20_4_ * fVar135;
          auVar55._20_4_ = fVar335;
          fVar338 = auVar15._24_4_ * fVar206;
          auVar55._24_4_ = fVar338;
          auVar55._28_4_ = auVar120._28_4_;
          auVar15 = vsubps_avx(auVar13,local_3c0);
          fVar161 = auVar15._0_4_ * fVar161;
          fVar225 = auVar15._4_4_ * fVar225;
          auVar56._4_4_ = fVar225;
          auVar56._0_4_ = fVar161;
          fVar229 = auVar15._8_4_ * fVar229;
          auVar56._8_4_ = fVar229;
          fVar234 = auVar15._12_4_ * fVar234;
          auVar56._12_4_ = fVar234;
          fVar200 = auVar15._16_4_ * fVar200;
          auVar56._16_4_ = fVar200;
          fVar135 = auVar15._20_4_ * fVar135;
          auVar56._20_4_ = fVar135;
          fVar206 = auVar15._24_4_ * fVar206;
          auVar56._24_4_ = fVar206;
          auVar56._28_4_ = 0x80000000;
          fVar182 = fVar181 * (fVar359 * local_600 + local_620._0_4_);
          fVar231 = fVar201 * (fVar362 * fStack_5fc + local_620._4_4_);
          fVar281 = fVar209 * (fVar293 * fStack_5f8 + local_620._8_4_);
          fVar304 = fVar232 * (fVar332 * fStack_5f4 + local_620._12_4_);
          fVar287 = fVar283 * (fVar134 * fStack_5f0 + local_620._16_4_);
          fVar205 = fVar318 * (fVar335 * fStack_5ec + local_620._20_4_);
          fVar207 = fVar290 * (fVar338 * fStack_5e8 + local_620._24_4_);
          auVar123._0_4_ = local_9a0 + fVar182 * fVar180;
          auVar123._4_4_ = fStack_99c + fVar231 * fVar247;
          auVar123._8_4_ = fStack_998 + fVar281 * fVar204;
          auVar123._12_4_ = fStack_994 + fVar304 * fVar230;
          auVar123._16_4_ = fStack_990 + fVar287 * fVar279;
          auVar123._20_4_ = fStack_98c + fVar205 * fVar291;
          auVar123._24_4_ = fStack_988 + fVar207 * fVar329;
          auVar123._28_4_ = fStack_984 + auVar12._28_4_ + auVar14._28_4_ + local_620._28_4_;
          auVar57._4_4_ = fVar362 * (float)local_8e0._4_4_;
          auVar57._0_4_ = fVar359 * (float)local_8e0._0_4_;
          auVar57._8_4_ = fVar293 * fStack_8d8;
          auVar57._12_4_ = fVar332 * fStack_8d4;
          auVar57._16_4_ = fVar134 * fStack_8d0;
          auVar57._20_4_ = fVar335 * fStack_8cc;
          auVar57._24_4_ = fVar338 * fStack_8c8;
          auVar57._28_4_ = auVar13._28_4_;
          _local_a20 = vsubps_avx(auVar57,auVar123);
          auVar9._4_4_ = fVar280;
          auVar9._0_4_ = fVar275;
          auVar9._8_4_ = fVar282;
          auVar9._12_4_ = fVar284;
          auVar9._16_4_ = fVar286;
          auVar9._20_4_ = fVar289;
          auVar9._24_4_ = fVar292;
          auVar9._28_4_ = fVar294;
          auVar222._0_4_ = fVar275 + fVar179 * fVar182;
          auVar222._4_4_ = fVar280 + fVar243 * fVar231;
          auVar222._8_4_ = fVar282 + fVar202 * fVar281;
          auVar222._12_4_ = fVar284 + fVar226 * fVar304;
          auVar222._16_4_ = fVar286 + fVar233 * fVar287;
          auVar222._20_4_ = fVar289 + fVar285 * fVar205;
          auVar222._24_4_ = fVar292 + fVar319 * fVar207;
          auVar222._28_4_ = fVar294 + auVar13._28_4_;
          auVar58._4_4_ = (float)local_6e0._4_4_ * fVar362;
          auVar58._0_4_ = (float)local_6e0._0_4_ * fVar359;
          auVar58._8_4_ = fStack_6d8 * fVar293;
          auVar58._12_4_ = fStack_6d4 * fVar332;
          auVar58._16_4_ = fStack_6d0 * fVar134;
          auVar58._20_4_ = fStack_6cc * fVar335;
          auVar58._24_4_ = fStack_6c8 * fVar338;
          auVar58._28_4_ = 0x3e000000;
          auVar13 = vsubps_avx(auVar58,auVar222);
          auVar195._0_4_ = fVar136 + fVar227 * fVar182;
          auVar195._4_4_ = fVar151 + fVar245 * fVar231;
          auVar195._8_4_ = fVar152 + fVar203 * fVar281;
          auVar195._12_4_ = fVar154 + fVar228 * fVar304;
          auVar195._16_4_ = fVar155 + fVar274 * fVar287;
          auVar195._20_4_ = fVar157 + fVar288 * fVar205;
          auVar195._24_4_ = fVar158 + fVar326 * fVar207;
          auVar195._28_4_ = fVar160 + auVar15._28_4_;
          auVar59._4_4_ = (float)local_700._4_4_ * fVar362;
          auVar59._0_4_ = (float)local_700._0_4_ * fVar359;
          auVar59._8_4_ = fStack_6f8 * fVar293;
          auVar59._12_4_ = fStack_6f4 * fVar332;
          auVar59._16_4_ = fStack_6f0 * fVar134;
          auVar59._20_4_ = fStack_6ec * fVar335;
          auVar59._24_4_ = fStack_6e8 * fVar338;
          auVar59._28_4_ = 0x3e000000;
          _local_a60 = vsubps_avx(auVar59,auVar195);
          fVar181 = fVar181 * (fVar161 * local_600 + local_620._0_4_);
          fVar201 = fVar201 * (fVar225 * fStack_5fc + local_620._4_4_);
          fVar209 = fVar209 * (fVar229 * fStack_5f8 + local_620._8_4_);
          fVar232 = fVar232 * (fVar234 * fStack_5f4 + local_620._12_4_);
          fVar283 = fVar283 * (fVar200 * fStack_5f0 + local_620._16_4_);
          fVar318 = fVar318 * (fVar135 * fStack_5ec + local_620._20_4_);
          fVar290 = fVar290 * (fVar206 * fStack_5e8 + local_620._24_4_);
          auVar196._0_4_ = local_9a0 + fVar181 * fVar180;
          auVar196._4_4_ = fStack_99c + fVar201 * fVar247;
          auVar196._8_4_ = fStack_998 + fVar209 * fVar204;
          auVar196._12_4_ = fStack_994 + fVar232 * fVar230;
          auVar196._16_4_ = fStack_990 + fVar283 * fVar279;
          auVar196._20_4_ = fStack_98c + fVar318 * fVar291;
          auVar196._24_4_ = fStack_988 + fVar290 * fVar329;
          auVar196._28_4_ = fStack_984 + local_a60._28_4_ + local_620._28_4_;
          auVar60._4_4_ = fVar225 * (float)local_8e0._4_4_;
          auVar60._0_4_ = fVar161 * (float)local_8e0._0_4_;
          auVar60._8_4_ = fVar229 * fStack_8d8;
          auVar60._12_4_ = fVar234 * fStack_8d4;
          auVar60._16_4_ = fVar200 * fStack_8d0;
          auVar60._20_4_ = fVar135 * fStack_8cc;
          auVar60._24_4_ = fVar206 * fStack_8c8;
          auVar60._28_4_ = fStack_8c4;
          auVar12 = vsubps_avx(auVar60,auVar196);
          auVar192 = auVar12._0_28_;
          auVar257._0_4_ = fVar275 + fVar179 * fVar181;
          auVar257._4_4_ = fVar280 + fVar243 * fVar201;
          auVar257._8_4_ = fVar282 + fVar202 * fVar209;
          auVar257._12_4_ = fVar284 + fVar226 * fVar232;
          auVar257._16_4_ = fVar286 + fVar233 * fVar283;
          auVar257._20_4_ = fVar289 + fVar285 * fVar318;
          auVar257._24_4_ = fVar292 + fVar319 * fVar290;
          auVar257._28_4_ = fVar294 + fStack_8c4;
          auVar61._4_4_ = (float)local_6e0._4_4_ * fVar225;
          auVar61._0_4_ = (float)local_6e0._0_4_ * fVar161;
          auVar61._8_4_ = fStack_6d8 * fVar229;
          auVar61._12_4_ = fStack_6d4 * fVar234;
          auVar61._16_4_ = fStack_6d0 * fVar200;
          auVar61._20_4_ = fStack_6cc * fVar135;
          auVar61._24_4_ = fStack_6c8 * fVar206;
          auVar61._28_4_ = fStack_6c4;
          auVar12 = vsubps_avx(auVar61,auVar257);
          auVar255 = auVar12._0_28_;
          auVar241._0_4_ = fVar136 + fVar227 * fVar181;
          auVar241._4_4_ = fVar151 + fVar245 * fVar201;
          auVar241._8_4_ = fVar152 + fVar203 * fVar209;
          auVar241._12_4_ = fVar154 + fVar228 * fVar232;
          auVar241._16_4_ = fVar155 + fVar274 * fVar283;
          auVar241._20_4_ = fVar157 + fVar288 * fVar318;
          auVar241._24_4_ = fVar158 + fVar326 * fVar290;
          auVar241._28_4_ = fVar160 + 0.125;
          auVar62._4_4_ = (float)local_700._4_4_ * fVar225;
          auVar62._0_4_ = (float)local_700._0_4_ * fVar161;
          auVar62._8_4_ = fStack_6f8 * fVar229;
          auVar62._12_4_ = fStack_6f4 * fVar234;
          auVar62._16_4_ = fStack_6f0 * fVar200;
          auVar62._20_4_ = fStack_6ec * fVar135;
          auVar62._24_4_ = fStack_6e8 * fVar206;
          auVar62._28_4_ = fStack_6c4;
          auVar12 = vsubps_avx(auVar62,auVar241);
          auVar240 = auVar12._0_28_;
          auVar17 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
          auVar272._8_4_ = 0x7f800000;
          auVar272._0_8_ = 0x7f8000007f800000;
          auVar272._12_4_ = 0x7f800000;
          auVar272._16_4_ = 0x7f800000;
          auVar272._20_4_ = 0x7f800000;
          auVar272._24_4_ = 0x7f800000;
          auVar272._28_4_ = 0x7f800000;
          auVar271 = vblendvps_avx(auVar272,auVar55,auVar17);
          auVar12 = vmaxps_avx(local_5e0,local_3a0);
          auVar63._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar63._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar63._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar63._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar63._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar63._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar63._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar63._28_4_ = auVar12._28_4_;
          auVar12 = vcmpps_avx(local_2c0,auVar63,1);
          auVar310._8_4_ = 0xff800000;
          auVar310._0_8_ = 0xff800000ff800000;
          auVar310._12_4_ = 0xff800000;
          auVar310._16_4_ = 0xff800000;
          auVar310._20_4_ = 0xff800000;
          auVar310._24_4_ = 0xff800000;
          auVar310._28_4_ = 0xff800000;
          auVar309 = vblendvps_avx(auVar310,auVar56,auVar17);
          auVar14 = auVar17 & auVar12;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar93 = vandps_avx(auVar12,auVar17);
            auVar167 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
            auVar14 = vcmpps_avx(local_980,_DAT_01f7b000,2);
            auVar131._8_4_ = 0xff800000;
            auVar131._0_8_ = 0xff800000ff800000;
            auVar131._12_4_ = 0xff800000;
            auVar131._16_4_ = 0xff800000;
            auVar131._20_4_ = 0xff800000;
            auVar131._24_4_ = 0xff800000;
            auVar131._28_4_ = 0xff800000;
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar150,auVar131,auVar14);
            auVar80 = vpmovsxwd_avx(auVar167);
            auVar167 = vpunpckhwd_avx(auVar167,auVar167);
            auVar357._16_16_ = auVar167;
            auVar357._0_16_ = auVar80;
            auVar271 = vblendvps_avx(auVar271,auVar12,auVar357);
            auVar12 = vblendvps_avx(auVar131,auVar150,auVar14);
            auVar309 = vblendvps_avx(auVar309,auVar12,auVar357);
            auVar178._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
            auVar178._8_4_ = auVar93._8_4_ ^ 0xffffffff;
            auVar178._12_4_ = auVar93._12_4_ ^ 0xffffffff;
            auVar178._16_4_ = auVar93._16_4_ ^ 0xffffffff;
            auVar178._20_4_ = auVar93._20_4_ ^ 0xffffffff;
            auVar178._24_4_ = auVar93._24_4_ ^ 0xffffffff;
            auVar178._28_4_ = auVar93._28_4_ ^ 0xffffffff;
            auVar9 = vorps_avx(auVar14,auVar178);
            auVar93 = vandps_avx(auVar17,auVar9);
          }
          auVar217 = auVar13._0_28_;
          fVar161 = (float)local_a20._0_4_;
          fVar225 = (float)local_a20._4_4_;
          fVar179 = fStack_a18;
          fVar227 = fStack_a14;
          fVar180 = fStack_a10;
          fVar229 = fStack_a0c;
          fVar181 = fStack_a08;
          fVar234 = fStack_a04;
        }
        _local_460 = local_900;
        local_440 = vminps_avx(local_400,auVar271);
        _local_840 = vmaxps_avx(local_900,auVar309);
        auVar311 = ZEXT3264(_local_840);
        _local_420 = _local_840;
        auVar17 = vcmpps_avx(local_900,local_440,2);
        auVar273 = ZEXT3264(auVar17);
        local_660 = vandps_avx(auVar17,auVar120);
        auVar17 = vcmpps_avx(_local_840,local_400,2);
        local_860 = vandps_avx(auVar120,auVar17);
        auVar120 = vorps_avx(local_860,local_660);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          auStack_918 = auVar121._8_24_;
          auVar273 = ZEXT3264(_local_6e0);
          auVar311 = ZEXT3264(local_660);
          auVar146._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
          auVar146._8_4_ = auVar93._8_4_ ^ 0xffffffff;
          auVar146._12_4_ = auVar93._12_4_ ^ 0xffffffff;
          auVar146._16_4_ = auVar93._16_4_ ^ 0xffffffff;
          auVar146._20_4_ = auVar93._20_4_ ^ 0xffffffff;
          auVar146._24_4_ = auVar93._24_4_ ^ 0xffffffff;
          auVar146._28_4_ = auVar93._28_4_ ^ 0xffffffff;
          auVar99._0_4_ =
               (float)local_8e0._0_4_ * auVar192._0_4_ +
               (float)local_6e0._0_4_ * auVar255._0_4_ + (float)local_700._0_4_ * auVar240._0_4_;
          auVar99._4_4_ =
               (float)local_8e0._4_4_ * auVar192._4_4_ +
               (float)local_6e0._4_4_ * auVar255._4_4_ + (float)local_700._4_4_ * auVar240._4_4_;
          auVar99._8_4_ =
               fStack_8d8 * auVar192._8_4_ +
               fStack_6d8 * auVar255._8_4_ + fStack_6f8 * auVar240._8_4_;
          auVar99._12_4_ =
               fStack_8d4 * auVar192._12_4_ +
               fStack_6d4 * auVar255._12_4_ + fStack_6f4 * auVar240._12_4_;
          auVar99._16_4_ =
               fStack_8d0 * auVar192._16_4_ +
               fStack_6d0 * auVar255._16_4_ + fStack_6f0 * auVar240._16_4_;
          auVar99._20_4_ =
               fStack_8cc * auVar192._20_4_ +
               fStack_6cc * auVar255._20_4_ + fStack_6ec * auVar240._20_4_;
          auVar99._24_4_ =
               fStack_8c8 * auVar192._24_4_ +
               fStack_6c8 * auVar255._24_4_ + fStack_6e8 * auVar240._24_4_;
          auVar99._28_4_ = auVar9._28_4_ + local_660._28_4_ + auVar120._28_4_;
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar197._16_4_ = 0x7fffffff;
          auVar197._20_4_ = 0x7fffffff;
          auVar197._24_4_ = 0x7fffffff;
          auVar197._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar99,auVar197);
          auVar242._8_4_ = 0x3e99999a;
          auVar242._0_8_ = 0x3e99999a3e99999a;
          auVar242._12_4_ = 0x3e99999a;
          auVar242._16_4_ = 0x3e99999a;
          auVar242._20_4_ = 0x3e99999a;
          auVar242._24_4_ = 0x3e99999a;
          auVar242._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar242,1);
          _local_6a0 = vorps_avx(auVar120,auVar146);
          auVar100._0_4_ =
               (float)local_8e0._0_4_ * fVar161 +
               (float)local_6e0._0_4_ * auVar217._0_4_ +
               (float)local_700._0_4_ * (float)local_a60._0_4_;
          auVar100._4_4_ =
               (float)local_8e0._4_4_ * fVar225 +
               (float)local_6e0._4_4_ * auVar217._4_4_ +
               (float)local_700._4_4_ * (float)local_a60._4_4_;
          auVar100._8_4_ =
               fStack_8d8 * fVar179 + fStack_6d8 * auVar217._8_4_ + fStack_6f8 * fStack_a58;
          auVar100._12_4_ =
               fStack_8d4 * fVar227 + fStack_6d4 * auVar217._12_4_ + fStack_6f4 * fStack_a54;
          auVar100._16_4_ =
               fStack_8d0 * fVar180 + fStack_6d0 * auVar217._16_4_ + fStack_6f0 * fStack_a50;
          auVar100._20_4_ =
               fStack_8cc * fVar229 + fStack_6cc * auVar217._20_4_ + fStack_6ec * fStack_a4c;
          auVar100._24_4_ =
               fStack_8c8 * fVar181 + fStack_6c8 * auVar217._24_4_ + fStack_6e8 * fStack_a48;
          auVar100._28_4_ = local_6a0._28_4_ + fVar234 + auVar9._28_4_;
          auVar120 = vandps_avx(auVar100,auVar197);
          auVar120 = vcmpps_avx(auVar120,auVar242,1);
          auVar120 = vorps_avx(auVar120,auVar146);
          auVar124._8_4_ = 3;
          auVar124._0_8_ = 0x300000003;
          auVar124._12_4_ = 3;
          auVar124._16_4_ = 3;
          auVar124._20_4_ = 3;
          auVar124._24_4_ = 3;
          auVar124._28_4_ = 3;
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar147,auVar124,auVar120);
          local_6c0 = ZEXT432(local_c88);
          auVar80 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar167 = vpcmpgtd_avx(auVar120._16_16_,auVar80);
          local_720._0_16_ = auVar80;
          auVar80 = vpcmpgtd_avx(auVar120._0_16_,auVar80);
          auVar125._16_16_ = auVar167;
          auVar125._0_16_ = auVar80;
          local_680 = vblendps_avx(ZEXT1632(auVar80),auVar125,0xf0);
          auVar120 = vandnps_avx(local_680,local_660);
          local_880._4_4_ = local_900._4_4_ + (float)local_8c0._4_4_;
          local_880._0_4_ = local_900._0_4_ + (float)local_8c0._0_4_;
          fStack_878 = local_900._8_4_ + fStack_8b8;
          fStack_874 = local_900._12_4_ + fStack_8b4;
          fStack_870 = local_900._16_4_ + fStack_8b0;
          fStack_86c = local_900._20_4_ + fStack_8ac;
          fStack_868 = local_900._24_4_ + fStack_8a8;
          fStack_864 = local_900._28_4_ + fStack_8a4;
          while( true ) {
            local_480 = auVar120;
            local_af0 = auVar105._0_4_;
            fStack_aec = auVar105._4_4_;
            fStack_ae8 = auVar105._8_4_;
            fStack_ae4 = auVar105._12_4_;
            local_ad0 = auVar81._0_4_;
            fStack_acc = auVar81._4_4_;
            fStack_ac8 = auVar81._8_4_;
            fStack_ac4 = auVar81._12_4_;
            local_ae0 = auVar82._0_4_;
            fStack_adc = auVar82._4_4_;
            fStack_ad8 = auVar82._8_4_;
            fStack_ad4 = auVar82._12_4_;
            local_ac0 = auVar11._0_4_;
            fStack_abc = auVar11._4_4_;
            fStack_ab8 = auVar11._8_4_;
            fStack_ab4 = auVar11._12_4_;
            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar120 >> 0x7f,0) == '\0') &&
                  (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0xbf,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar120[0x1f]) break;
            auVar126._8_4_ = 0x7f800000;
            auVar126._0_8_ = 0x7f8000007f800000;
            auVar126._12_4_ = 0x7f800000;
            auVar126._16_4_ = 0x7f800000;
            auVar126._20_4_ = 0x7f800000;
            auVar126._24_4_ = 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar93 = vblendvps_avx(auVar126,local_900,auVar120);
            auVar17 = vshufps_avx(auVar93,auVar93,0xb1);
            auVar17 = vminps_avx(auVar93,auVar17);
            auVar12 = vshufpd_avx(auVar17,auVar17,5);
            auVar17 = vminps_avx(auVar17,auVar12);
            auVar12 = vperm2f128_avx(auVar17,auVar17,1);
            auVar17 = vminps_avx(auVar17,auVar12);
            auVar93 = vcmpps_avx(auVar93,auVar17,0);
            auVar17 = auVar120 & auVar93;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar120 = vandps_avx(auVar93,auVar120);
            }
            uVar72 = vmovmskps_avx(auVar120);
            uVar77 = 0;
            if (uVar72 != 0) {
              for (; (uVar72 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
              }
            }
            uVar76 = (ulong)uVar77;
            *(undefined4 *)(local_480 + uVar76 * 4) = 0;
            fVar161 = local_1a0[uVar76];
            uVar77 = *(uint *)(local_460 + uVar76 * 4);
            fVar225 = auVar106._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar273 = ZEXT1664(auVar273._0_16_);
              auVar311 = ZEXT1664(auVar311._0_16_);
              fVar225 = sqrtf((float)local_9c0._0_4_);
            }
            auVar80 = vminps_avx(auVar11,auVar82);
            auVar167 = vmaxps_avx(auVar11,auVar82);
            auVar104 = vminps_avx(auVar81,auVar105);
            auVar85 = vminps_avx(auVar80,auVar104);
            auVar80 = vmaxps_avx(auVar81,auVar105);
            auVar104 = vmaxps_avx(auVar167,auVar80);
            auVar164._8_4_ = 0x7fffffff;
            auVar164._0_8_ = 0x7fffffff7fffffff;
            auVar164._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar85,auVar164);
            auVar80 = vandps_avx(auVar104,auVar164);
            auVar167 = vmaxps_avx(auVar167,auVar80);
            auVar80 = vmovshdup_avx(auVar167);
            auVar80 = vmaxss_avx(auVar80,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar80);
            local_9a0 = auVar167._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar225 * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar104,auVar104,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar77),ZEXT416((uint)fVar161),0x10);
            auVar297 = ZEXT1664(auVar167);
            lVar73 = 5;
            do {
              do {
                auVar167 = auVar297._0_16_;
                bVar79 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar79) goto LAB_00809171;
                auVar80 = vshufps_avx(auVar167,auVar167,0);
                auVar84._0_4_ = auVar80._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar84._4_4_ = auVar80._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar84._8_4_ = auVar80._8_4_ * fStack_9a8 + 0.0;
                auVar84._12_4_ = auVar80._12_4_ * fStack_9a4 + 0.0;
                auVar80 = vmovshdup_avx(auVar167);
                fVar229 = auVar80._0_4_;
                fVar227 = 1.0 - fVar229;
                fVar225 = fVar229 * 3.0;
                fVar161 = fVar225 + -5.0;
                fVar179 = fVar227 * fVar227;
                auVar80 = ZEXT416((uint)(fVar229 * fVar229 * -fVar227 * 0.5));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar104 = ZEXT416((uint)((fVar179 * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar85 = ZEXT416((uint)((fVar229 * fVar229 * fVar161 + 2.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar107 = ZEXT416((uint)(fVar227 * fVar227 * -fVar229 * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar139._0_4_ =
                     auVar107._0_4_ * local_ac0 +
                     auVar85._0_4_ * local_ae0 +
                     auVar104._0_4_ * local_ad0 + auVar80._0_4_ * local_af0;
                auVar139._4_4_ =
                     auVar107._4_4_ * fStack_abc +
                     auVar85._4_4_ * fStack_adc +
                     auVar104._4_4_ * fStack_acc + auVar80._4_4_ * fStack_aec;
                auVar139._8_4_ =
                     auVar107._8_4_ * fStack_ab8 +
                     auVar85._8_4_ * fStack_ad8 +
                     auVar104._8_4_ * fStack_ac8 + auVar80._8_4_ * fStack_ae8;
                auVar139._12_4_ =
                     auVar107._12_4_ * fStack_ab4 +
                     auVar85._12_4_ * fStack_ad4 +
                     auVar104._12_4_ * fStack_ac4 + auVar80._12_4_ * fStack_ae4;
                _local_a20 = auVar139;
                auVar80 = vsubps_avx(auVar84,auVar139);
                _local_a60 = auVar80;
                auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar180 = auVar80._0_4_;
                if (fVar180 < 0.0) {
                  local_9e0._0_4_ = fVar229 * 9.0;
                  local_a00._0_4_ = fVar161;
                  local_a80._0_4_ = fVar179;
                  local_800._0_4_ = fVar227 * -2.0;
                  fVar181 = sqrtf(fVar180);
                  fVar161 = (float)local_a00._0_4_;
                  fVar243 = (float)local_9e0._0_4_;
                  fVar234 = (float)local_800._0_4_;
                  fVar179 = (float)local_a80._0_4_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar80,auVar80);
                  fVar181 = auVar104._0_4_;
                  fVar243 = fVar229 * 9.0;
                  fVar234 = fVar227 * -2.0;
                }
                auVar104 = ZEXT416((uint)((fVar229 * fVar229 + fVar229 * fVar234) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar85 = ZEXT416((uint)(((fVar227 + fVar227) * (fVar225 + 2.0) +
                                         fVar227 * fVar227 * -3.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar107 = ZEXT416((uint)((fVar161 * (fVar229 + fVar229) + fVar229 * fVar225) * 0.5)
                                  );
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar108 = ZEXT416((uint)((fVar229 * (fVar227 + fVar227) - fVar179) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar306._0_4_ =
                     local_ac0 * auVar108._0_4_ +
                     local_ae0 * auVar107._0_4_ +
                     local_af0 * auVar104._0_4_ + local_ad0 * auVar85._0_4_;
                auVar306._4_4_ =
                     fStack_abc * auVar108._4_4_ +
                     fStack_adc * auVar107._4_4_ +
                     fStack_aec * auVar104._4_4_ + fStack_acc * auVar85._4_4_;
                auVar306._8_4_ =
                     fStack_ab8 * auVar108._8_4_ +
                     fStack_ad8 * auVar107._8_4_ +
                     fStack_ae8 * auVar104._8_4_ + fStack_ac8 * auVar85._8_4_;
                auVar306._12_4_ =
                     fStack_ab4 * auVar108._12_4_ +
                     fStack_ad4 * auVar107._12_4_ +
                     fStack_ae4 * auVar104._12_4_ + fStack_ac4 * auVar85._12_4_;
                auVar108 = vpermilps_avx(ZEXT416((uint)(fVar225 + -1.0)),0);
                auVar138 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar104 = vshufps_avx(ZEXT416((uint)(fVar243 + -5.0)),
                                       ZEXT416((uint)(fVar243 + -5.0)),0);
                auVar85 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar107 = vshufps_avx(auVar85,auVar85,0);
                auVar85 = vdpps_avx(auVar306,auVar306,0x7f);
                auVar109._0_4_ =
                     local_ac0 * auVar107._0_4_ +
                     local_ae0 * auVar104._0_4_ +
                     local_ad0 * auVar138._0_4_ + local_af0 * auVar108._0_4_;
                auVar109._4_4_ =
                     fStack_abc * auVar107._4_4_ +
                     fStack_adc * auVar104._4_4_ +
                     fStack_acc * auVar138._4_4_ + fStack_aec * auVar108._4_4_;
                auVar109._8_4_ =
                     fStack_ab8 * auVar107._8_4_ +
                     fStack_ad8 * auVar104._8_4_ +
                     fStack_ac8 * auVar138._8_4_ + fStack_ae8 * auVar108._8_4_;
                auVar109._12_4_ =
                     fStack_ab4 * auVar107._12_4_ +
                     fStack_ad4 * auVar104._12_4_ +
                     fStack_ac4 * auVar138._12_4_ + fStack_ae4 * auVar108._12_4_;
                auVar104 = vblendps_avx(auVar85,_DAT_01f45a50,0xe);
                auVar107 = vrsqrtss_avx(auVar104,auVar104);
                fVar225 = auVar107._0_4_;
                fVar161 = auVar85._0_4_;
                auVar107 = vdpps_avx(auVar306,auVar109,0x7f);
                auVar108 = vshufps_avx(auVar85,auVar85,0);
                auVar110._0_4_ = auVar109._0_4_ * auVar108._0_4_;
                auVar110._4_4_ = auVar109._4_4_ * auVar108._4_4_;
                auVar110._8_4_ = auVar109._8_4_ * auVar108._8_4_;
                auVar110._12_4_ = auVar109._12_4_ * auVar108._12_4_;
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar184._0_4_ = auVar306._0_4_ * auVar107._0_4_;
                auVar184._4_4_ = auVar306._4_4_ * auVar107._4_4_;
                auVar184._8_4_ = auVar306._8_4_ * auVar107._8_4_;
                auVar184._12_4_ = auVar306._12_4_ * auVar107._12_4_;
                auVar138 = vsubps_avx(auVar110,auVar184);
                auVar107 = vrcpss_avx(auVar104,auVar104);
                auVar104 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                      ZEXT416((uint)(auVar297._0_4_ * (float)local_980._0_4_)));
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - fVar161 * auVar107._0_4_)));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                uVar76 = CONCAT44(auVar306._4_4_,auVar306._0_4_);
                auVar213._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar213._8_4_ = -auVar306._8_4_;
                auVar213._12_4_ = -auVar306._12_4_;
                auVar108 = ZEXT416((uint)(fVar225 * 1.5 +
                                         fVar161 * -0.5 * fVar225 * fVar225 * fVar225));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar165._0_4_ = auVar108._0_4_ * auVar138._0_4_ * auVar107._0_4_;
                auVar165._4_4_ = auVar108._4_4_ * auVar138._4_4_ * auVar107._4_4_;
                auVar165._8_4_ = auVar108._8_4_ * auVar138._8_4_ * auVar107._8_4_;
                auVar165._12_4_ = auVar108._12_4_ * auVar138._12_4_ * auVar107._12_4_;
                auVar238._0_4_ = auVar306._0_4_ * auVar108._0_4_;
                auVar238._4_4_ = auVar306._4_4_ * auVar108._4_4_;
                auVar238._8_4_ = auVar306._8_4_ * auVar108._8_4_;
                auVar238._12_4_ = auVar306._12_4_ * auVar108._12_4_;
                if (fVar161 < 0.0) {
                  fVar161 = sqrtf(fVar161);
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar161 = auVar85._0_4_;
                }
                auVar85 = vdpps_avx(_local_a60,auVar238,0x7f);
                fVar161 = (local_9a0 / fVar161) * (fVar181 + 1.0) +
                          auVar104._0_4_ + fVar181 * local_9a0;
                auVar107 = vdpps_avx(auVar213,auVar238,0x7f);
                auVar108 = vdpps_avx(_local_a60,auVar165,0x7f);
                auVar138 = vdpps_avx(_local_9b0,auVar238,0x7f);
                auVar162 = vdpps_avx(_local_a60,auVar213,0x7f);
                fVar225 = auVar107._0_4_ + auVar108._0_4_;
                fVar179 = auVar85._0_4_;
                auVar86._0_4_ = fVar179 * fVar179;
                auVar86._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar86._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar86._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar108 = vsubps_avx(auVar80,auVar86);
                auVar107 = vdpps_avx(_local_a60,_local_9b0,0x7f);
                fVar227 = auVar162._0_4_ - fVar179 * fVar225;
                fVar229 = auVar107._0_4_ - fVar179 * auVar138._0_4_;
                auVar107 = vrsqrtss_avx(auVar108,auVar108);
                fVar181 = auVar108._0_4_;
                fVar179 = auVar107._0_4_;
                fVar179 = fVar179 * 1.5 + fVar181 * -0.5 * fVar179 * fVar179 * fVar179;
                if (fVar181 < 0.0) {
                  local_9e0._0_4_ = fVar227;
                  local_a00._0_4_ = fVar229;
                  local_a80._0_4_ = fVar179;
                  fVar181 = sqrtf(fVar181);
                  fVar179 = (float)local_a80._0_4_;
                  fVar227 = (float)local_9e0._0_4_;
                  fVar229 = (float)local_a00._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar108,auVar108);
                  fVar181 = auVar107._0_4_;
                }
                auVar311 = ZEXT1664(auVar85);
                auVar273 = ZEXT1664(auVar306);
                auVar162 = vpermilps_avx(_local_a20,0xff);
                auVar163 = vshufps_avx(auVar306,auVar306,0xff);
                fVar227 = fVar227 * fVar179 - auVar163._0_4_;
                auVar185._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar138._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar138._12_4_ ^ 0x80000000;
                auVar214._0_4_ = -fVar227;
                auVar214._4_4_ = 0x80000000;
                auVar214._8_4_ = 0x80000000;
                auVar214._12_4_ = 0x80000000;
                auVar107 = vinsertps_avx(auVar214,ZEXT416((uint)(fVar229 * fVar179)),0x1c);
                auVar138 = vmovsldup_avx(ZEXT416((uint)(fVar225 * fVar229 * fVar179 -
                                                       auVar138._0_4_ * fVar227)));
                auVar107 = vdivps_avx(auVar107,auVar138);
                auVar108 = vinsertps_avx(ZEXT416((uint)fVar225),auVar185,0x10);
                auVar108 = vdivps_avx(auVar108,auVar138);
                auVar138 = vmovsldup_avx(auVar85);
                auVar87 = ZEXT416((uint)(fVar181 - auVar162._0_4_));
                auVar162 = vmovsldup_avx(auVar87);
                auVar140._0_4_ = auVar138._0_4_ * auVar107._0_4_ + auVar162._0_4_ * auVar108._0_4_;
                auVar140._4_4_ = auVar138._4_4_ * auVar107._4_4_ + auVar162._4_4_ * auVar108._4_4_;
                auVar140._8_4_ = auVar138._8_4_ * auVar107._8_4_ + auVar162._8_4_ * auVar108._8_4_;
                auVar140._12_4_ =
                     auVar138._12_4_ * auVar107._12_4_ + auVar162._12_4_ * auVar108._12_4_;
                auVar107 = vsubps_avx(auVar167,auVar140);
                auVar297 = ZEXT1664(auVar107);
                auVar141._8_4_ = 0x7fffffff;
                auVar141._0_8_ = 0x7fffffff7fffffff;
                auVar141._12_4_ = 0x7fffffff;
                auVar167 = vandps_avx(auVar85,auVar141);
              } while (fVar161 <= auVar167._0_4_);
              auVar166._8_4_ = 0x7fffffff;
              auVar166._0_8_ = 0x7fffffff7fffffff;
              auVar166._12_4_ = 0x7fffffff;
              auVar167 = vandps_avx(auVar87,auVar166);
            } while ((float)local_820._0_4_ * 1.9073486e-06 + auVar104._0_4_ + fVar161 <=
                     auVar167._0_4_);
            fVar161 = auVar107._0_4_ + (float)local_950._0_4_;
            if ((fVar208 <= fVar161) &&
               (fVar225 = *(float *)(ray + k * 4 + 0x80), fVar161 <= fVar225)) {
              auVar167 = vmovshdup_avx(auVar107);
              fVar179 = auVar167._0_4_;
              if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                auVar167 = vrsqrtss_avx(auVar80,auVar80);
                fVar227 = auVar167._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar71].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar167 = ZEXT416((uint)(fVar227 * 1.5 +
                                           fVar180 * -0.5 * fVar227 * fVar227 * fVar227));
                  auVar167 = vshufps_avx(auVar167,auVar167,0);
                  auVar168._0_4_ = auVar167._0_4_ * (float)local_a60._0_4_;
                  auVar168._4_4_ = auVar167._4_4_ * (float)local_a60._4_4_;
                  auVar168._8_4_ = auVar167._8_4_ * fStack_a58;
                  auVar168._12_4_ = auVar167._12_4_ * fStack_a54;
                  auVar111._0_4_ = auVar306._0_4_ + auVar163._0_4_ * auVar168._0_4_;
                  auVar111._4_4_ = auVar306._4_4_ + auVar163._4_4_ * auVar168._4_4_;
                  auVar111._8_4_ = auVar306._8_4_ + auVar163._8_4_ * auVar168._8_4_;
                  auVar111._12_4_ = auVar306._12_4_ + auVar163._12_4_ * auVar168._12_4_;
                  auVar167 = vshufps_avx(auVar168,auVar168,0xc9);
                  auVar80 = vshufps_avx(auVar306,auVar306,0xc9);
                  auVar169._0_4_ = auVar80._0_4_ * auVar168._0_4_;
                  auVar169._4_4_ = auVar80._4_4_ * auVar168._4_4_;
                  auVar169._8_4_ = auVar80._8_4_ * auVar168._8_4_;
                  auVar169._12_4_ = auVar80._12_4_ * auVar168._12_4_;
                  auVar186._0_4_ = auVar306._0_4_ * auVar167._0_4_;
                  auVar186._4_4_ = auVar306._4_4_ * auVar167._4_4_;
                  auVar186._8_4_ = auVar306._8_4_ * auVar167._8_4_;
                  auVar186._12_4_ = auVar306._12_4_ * auVar167._12_4_;
                  auVar104 = vsubps_avx(auVar186,auVar169);
                  auVar167 = vshufps_avx(auVar104,auVar104,0xc9);
                  auVar80 = vshufps_avx(auVar111,auVar111,0xc9);
                  auVar187._0_4_ = auVar80._0_4_ * auVar167._0_4_;
                  auVar187._4_4_ = auVar80._4_4_ * auVar167._4_4_;
                  auVar187._8_4_ = auVar80._8_4_ * auVar167._8_4_;
                  auVar187._12_4_ = auVar80._12_4_ * auVar167._12_4_;
                  auVar167 = vshufps_avx(auVar104,auVar104,0xd2);
                  auVar112._0_4_ = auVar111._0_4_ * auVar167._0_4_;
                  auVar112._4_4_ = auVar111._4_4_ * auVar167._4_4_;
                  auVar112._8_4_ = auVar111._8_4_ * auVar167._8_4_;
                  auVar112._12_4_ = auVar111._12_4_ * auVar167._12_4_;
                  auVar167 = vsubps_avx(auVar187,auVar112);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar161;
                    uVar1 = vextractps_avx(auVar167,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar167,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_920;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar107,auVar107,0x55);
                    auVar80 = vshufps_avx(auVar167,auVar167,0x55);
                    auStack_7b0 = vshufps_avx(auVar167,auVar167,0xaa);
                    local_7a0 = vshufps_avx(auVar167,auVar167,0);
                    local_7c0 = (RTCHitN  [16])auVar80;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar77 = context->user->instPrimID[0];
                    auVar113._4_4_ = uVar77;
                    auVar113._0_4_ = uVar77;
                    auVar113._8_4_ = uVar77;
                    auVar113._12_4_ = uVar77;
                    auStack_740 = auVar113;
                    *(float *)(ray + k * 4 + 0x80) = fVar161;
                    local_8a0._0_16_ = *local_a28;
                    local_ab0.valid = (int *)local_8a0;
                    local_ab0.geometryUserPtr = pGVar3->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = local_7c0;
                    local_ab0.N = 4;
                    auVar167 = *local_a28;
                    local_ab0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar273 = ZEXT1664(auVar306);
                      auVar311 = ZEXT1664(auVar85);
                      (*pGVar3->intersectionFilterN)(&local_ab0);
                      auVar132._8_56_ = extraout_var;
                      auVar132._0_8_ = extraout_XMM1_Qa;
                      auVar113 = auVar132._0_16_;
                      auVar167 = local_8a0._0_16_;
                    }
                    if (auVar167 == (undefined1  [16])0x0) {
                      auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar167 = vpcmpeqd_avx(auVar113,auVar113);
                      auVar80 = auVar80 ^ auVar167;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar104 = vpcmpeqd_avx(auVar80,auVar80);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        auVar311 = ZEXT1664(auVar311._0_16_);
                        (*p_Var4)(&local_ab0);
                        auVar104 = vpcmpeqd_avx(auVar104,auVar104);
                        auVar167 = local_8a0._0_16_;
                      }
                      auVar85 = vpcmpeqd_avx(auVar167,_DAT_01f45a50);
                      auVar80 = auVar85 ^ auVar104;
                      if (auVar167 != (undefined1  [16])0x0) {
                        auVar85 = auVar85 ^ auVar104;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])local_ab0.hit);
                        *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x10));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x20));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x30));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x40));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x50));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x60));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x70));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar167;
                        auVar167 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x80));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar167;
                      }
                    }
                    auVar88._8_8_ = 0x100000001;
                    auVar88._0_8_ = 0x100000001;
                    if ((auVar88 & auVar80) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar225;
                    }
                  }
                }
              }
            }
LAB_00809171:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar96._4_4_ = uVar1;
            auVar96._0_4_ = uVar1;
            auVar96._8_4_ = uVar1;
            auVar96._12_4_ = uVar1;
            auVar96._16_4_ = uVar1;
            auVar96._20_4_ = uVar1;
            auVar96._24_4_ = uVar1;
            auVar96._28_4_ = uVar1;
            auVar120 = vcmpps_avx(_local_880,auVar96,2);
            auVar120 = vandps_avx(auVar120,local_480);
          }
          auVar101._0_4_ = (float)local_8c0._0_4_ + (float)local_840._0_4_;
          auVar101._4_4_ = (float)local_8c0._4_4_ + (float)local_840._4_4_;
          auVar101._8_4_ = fStack_8b8 + fStack_838;
          auVar101._12_4_ = fStack_8b4 + fStack_834;
          auVar101._16_4_ = fStack_8b0 + fStack_830;
          auVar101._20_4_ = fStack_8ac + fStack_82c;
          auVar101._24_4_ = fStack_8a8 + fStack_828;
          auVar101._28_4_ = fStack_8a4 + fStack_824;
          auVar167 = vshufps_avx(auVar96._0_16_,auVar96._0_16_,0);
          auVar127._16_16_ = auVar167;
          auVar127._0_16_ = auVar167;
          auVar120 = vcmpps_avx(auVar101,auVar127,2);
          local_860 = vandps_avx(auVar120,local_860);
          auVar102._8_4_ = 3;
          auVar102._0_8_ = 0x300000003;
          auVar102._12_4_ = 3;
          auVar102._16_4_ = 3;
          auVar102._20_4_ = 3;
          auVar102._24_4_ = 3;
          auVar102._28_4_ = 3;
          auVar128._8_4_ = 2;
          auVar128._0_8_ = 0x200000002;
          auVar128._12_4_ = 2;
          auVar128._16_4_ = 2;
          auVar128._20_4_ = 2;
          auVar128._24_4_ = 2;
          auVar128._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar128,auVar102,_local_6a0);
          auVar167 = vpcmpgtd_avx(auVar120._16_16_,local_720._0_16_);
          auVar80 = vpshufd_avx(local_6c0._0_16_,0);
          auVar80 = vpcmpgtd_avx(auVar120._0_16_,auVar80);
          auVar129._16_16_ = auVar167;
          auVar129._0_16_ = auVar80;
          _local_880 = vblendps_avx(ZEXT1632(auVar80),auVar129,0xf0);
          local_8a0 = vandnps_avx(_local_880,local_860);
          local_900 = _local_420;
          local_840._4_4_ = (float)local_8c0._4_4_ + (float)local_420._4_4_;
          local_840._0_4_ = (float)local_8c0._0_4_ + (float)local_420._0_4_;
          fStack_838 = fStack_8b8 + fStack_418;
          fStack_834 = fStack_8b4 + fStack_414;
          fStack_830 = fStack_8b0 + fStack_410;
          fStack_82c = fStack_8ac + fStack_40c;
          fStack_828 = fStack_8a8 + fStack_408;
          fStack_824 = fStack_8a4 + fStack_404;
          fVar161 = (float)local_8c0._0_4_;
          fVar225 = (float)local_8c0._4_4_;
          fVar179 = fStack_8b8;
          fVar227 = fStack_8b4;
          fVar180 = fStack_8b0;
          fVar229 = fStack_8ac;
          fVar181 = fStack_8a8;
          fVar234 = fStack_8a4;
          while ((((((((local_8a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_8a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_8a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_8a0 >> 0x7f,0) != '\0') ||
                   (local_8a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_8a0 >> 0xbf,0) != '\0') ||
                 (local_8a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_8a0[0x1f] < '\0') {
            auVar130._8_4_ = 0x7f800000;
            auVar130._0_8_ = 0x7f8000007f800000;
            auVar130._12_4_ = 0x7f800000;
            auVar130._16_4_ = 0x7f800000;
            auVar130._20_4_ = 0x7f800000;
            auVar130._24_4_ = 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar120 = vblendvps_avx(auVar130,local_900,local_8a0);
            auVar93 = vshufps_avx(auVar120,auVar120,0xb1);
            auVar93 = vminps_avx(auVar120,auVar93);
            auVar17 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar17);
            auVar17 = vperm2f128_avx(auVar93,auVar93,1);
            auVar93 = vminps_avx(auVar93,auVar17);
            auVar93 = vcmpps_avx(auVar120,auVar93,0);
            auVar17 = local_8a0 & auVar93;
            auVar120 = local_8a0;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar120 = vandps_avx(auVar93,local_8a0);
            }
            uVar72 = vmovmskps_avx(auVar120);
            uVar77 = 0;
            if (uVar72 != 0) {
              for (; (uVar72 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
              }
            }
            uVar76 = (ulong)uVar77;
            *(undefined4 *)(local_8a0 + uVar76 * 4) = 0;
            fVar161 = local_1c0[uVar76];
            uVar77 = *(uint *)(local_400 + uVar76 * 4);
            fVar225 = auVar10._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar273 = ZEXT1664(auVar273._0_16_);
              fVar225 = sqrtf((float)local_9c0._0_4_);
            }
            auVar80 = vminps_avx(auVar11,auVar82);
            auVar167 = vmaxps_avx(auVar11,auVar82);
            auVar104 = vminps_avx(auVar81,auVar105);
            auVar85 = vminps_avx(auVar80,auVar104);
            auVar80 = vmaxps_avx(auVar81,auVar105);
            auVar104 = vmaxps_avx(auVar167,auVar80);
            auVar170._8_4_ = 0x7fffffff;
            auVar170._0_8_ = 0x7fffffff7fffffff;
            auVar170._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar85,auVar170);
            auVar80 = vandps_avx(auVar104,auVar170);
            auVar167 = vmaxps_avx(auVar167,auVar80);
            auVar80 = vmovshdup_avx(auVar167);
            auVar80 = vmaxss_avx(auVar80,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar80);
            local_9a0 = auVar167._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar225 * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar104,auVar104,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar77),ZEXT416((uint)fVar161),0x10);
            auVar311 = ZEXT1664(auVar167);
            lVar73 = 5;
            do {
              do {
                auVar167 = auVar311._0_16_;
                bVar79 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar79) goto LAB_00809def;
                auVar80 = vshufps_avx(auVar167,auVar167,0);
                auVar89._0_4_ = auVar80._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar89._4_4_ = auVar80._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar89._8_4_ = auVar80._8_4_ * fStack_9a8 + 0.0;
                auVar89._12_4_ = auVar80._12_4_ * fStack_9a4 + 0.0;
                auVar80 = vmovshdup_avx(auVar167);
                fVar229 = auVar80._0_4_;
                fVar227 = 1.0 - fVar229;
                fVar225 = fVar229 * 3.0;
                fVar161 = fVar225 + -5.0;
                fVar179 = fVar227 * fVar227;
                auVar80 = ZEXT416((uint)(fVar229 * fVar229 * -fVar227 * 0.5));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar104 = ZEXT416((uint)((fVar179 * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar85 = ZEXT416((uint)((fVar229 * fVar229 * fVar161 + 2.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar107 = ZEXT416((uint)(fVar227 * fVar227 * -fVar229 * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar142._0_4_ =
                     auVar107._0_4_ * local_ac0 +
                     auVar85._0_4_ * local_ae0 +
                     auVar104._0_4_ * local_ad0 + auVar80._0_4_ * local_af0;
                auVar142._4_4_ =
                     auVar107._4_4_ * fStack_abc +
                     auVar85._4_4_ * fStack_adc +
                     auVar104._4_4_ * fStack_acc + auVar80._4_4_ * fStack_aec;
                auVar142._8_4_ =
                     auVar107._8_4_ * fStack_ab8 +
                     auVar85._8_4_ * fStack_ad8 +
                     auVar104._8_4_ * fStack_ac8 + auVar80._8_4_ * fStack_ae8;
                auVar142._12_4_ =
                     auVar107._12_4_ * fStack_ab4 +
                     auVar85._12_4_ * fStack_ad4 +
                     auVar104._12_4_ * fStack_ac4 + auVar80._12_4_ * fStack_ae4;
                _local_a20 = auVar142;
                auVar80 = vsubps_avx(auVar89,auVar142);
                _local_a60 = auVar80;
                auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar180 = auVar80._0_4_;
                if (fVar180 < 0.0) {
                  local_9e0._0_4_ = fVar229 * 9.0;
                  local_a00._0_4_ = fVar161;
                  local_a80._0_4_ = fVar179;
                  local_800._0_4_ = fVar227 * -2.0;
                  fVar181 = sqrtf(fVar180);
                  fVar161 = (float)local_a00._0_4_;
                  fVar243 = (float)local_9e0._0_4_;
                  fVar234 = (float)local_800._0_4_;
                  fVar179 = (float)local_a80._0_4_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar80,auVar80);
                  fVar181 = auVar104._0_4_;
                  fVar243 = fVar229 * 9.0;
                  fVar234 = fVar227 * -2.0;
                }
                auVar104 = ZEXT416((uint)((fVar229 * fVar229 + fVar229 * fVar234) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar85 = ZEXT416((uint)(((fVar227 + fVar227) * (fVar225 + 2.0) +
                                         fVar227 * fVar227 * -3.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar107 = ZEXT416((uint)((fVar161 * (fVar229 + fVar229) + fVar229 * fVar225) * 0.5)
                                  );
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar108 = ZEXT416((uint)((fVar229 * (fVar227 + fVar227) - fVar179) * 0.5));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar296._0_4_ =
                     local_ac0 * auVar108._0_4_ +
                     local_ae0 * auVar107._0_4_ +
                     local_af0 * auVar104._0_4_ + local_ad0 * auVar85._0_4_;
                auVar296._4_4_ =
                     fStack_abc * auVar108._4_4_ +
                     fStack_adc * auVar107._4_4_ +
                     fStack_aec * auVar104._4_4_ + fStack_acc * auVar85._4_4_;
                auVar296._8_4_ =
                     fStack_ab8 * auVar108._8_4_ +
                     fStack_ad8 * auVar107._8_4_ +
                     fStack_ae8 * auVar104._8_4_ + fStack_ac8 * auVar85._8_4_;
                auVar296._12_4_ =
                     fStack_ab4 * auVar108._12_4_ +
                     fStack_ad4 * auVar107._12_4_ +
                     fStack_ae4 * auVar104._12_4_ + fStack_ac4 * auVar85._12_4_;
                auVar108 = vpermilps_avx(ZEXT416((uint)(fVar225 + -1.0)),0);
                auVar138 = vpermilps_avx(ZEXT416((uint)(fVar229 * -9.0 + 4.0)),0);
                auVar104 = vshufps_avx(ZEXT416((uint)(fVar243 + -5.0)),
                                       ZEXT416((uint)(fVar243 + -5.0)),0);
                auVar85 = ZEXT416((uint)(fVar229 * -3.0 + 2.0));
                auVar107 = vshufps_avx(auVar85,auVar85,0);
                auVar85 = vdpps_avx(auVar296,auVar296,0x7f);
                auVar114._0_4_ =
                     local_ac0 * auVar107._0_4_ +
                     local_ae0 * auVar104._0_4_ +
                     local_ad0 * auVar138._0_4_ + local_af0 * auVar108._0_4_;
                auVar114._4_4_ =
                     fStack_abc * auVar107._4_4_ +
                     fStack_adc * auVar104._4_4_ +
                     fStack_acc * auVar138._4_4_ + fStack_aec * auVar108._4_4_;
                auVar114._8_4_ =
                     fStack_ab8 * auVar107._8_4_ +
                     fStack_ad8 * auVar104._8_4_ +
                     fStack_ac8 * auVar138._8_4_ + fStack_ae8 * auVar108._8_4_;
                auVar114._12_4_ =
                     fStack_ab4 * auVar107._12_4_ +
                     fStack_ad4 * auVar104._12_4_ +
                     fStack_ac4 * auVar138._12_4_ + fStack_ae4 * auVar108._12_4_;
                auVar104 = vblendps_avx(auVar85,_DAT_01f45a50,0xe);
                auVar107 = vrsqrtss_avx(auVar104,auVar104);
                fVar225 = auVar107._0_4_;
                fVar161 = auVar85._0_4_;
                auVar107 = vdpps_avx(auVar296,auVar114,0x7f);
                auVar108 = vshufps_avx(auVar85,auVar85,0);
                auVar115._0_4_ = auVar114._0_4_ * auVar108._0_4_;
                auVar115._4_4_ = auVar114._4_4_ * auVar108._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar108._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar108._12_4_;
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar188._0_4_ = auVar296._0_4_ * auVar107._0_4_;
                auVar188._4_4_ = auVar296._4_4_ * auVar107._4_4_;
                auVar188._8_4_ = auVar296._8_4_ * auVar107._8_4_;
                auVar188._12_4_ = auVar296._12_4_ * auVar107._12_4_;
                auVar138 = vsubps_avx(auVar115,auVar188);
                auVar107 = vrcpss_avx(auVar104,auVar104);
                auVar104 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                      ZEXT416((uint)(auVar311._0_4_ * (float)local_980._0_4_)));
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - fVar161 * auVar107._0_4_)));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                uVar76 = CONCAT44(auVar296._4_4_,auVar296._0_4_);
                auVar215._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar215._8_4_ = -auVar296._8_4_;
                auVar215._12_4_ = -auVar296._12_4_;
                auVar108 = ZEXT416((uint)(fVar225 * 1.5 +
                                         fVar161 * -0.5 * fVar225 * fVar225 * fVar225));
                auVar108 = vshufps_avx(auVar108,auVar108,0);
                auVar171._0_4_ = auVar108._0_4_ * auVar138._0_4_ * auVar107._0_4_;
                auVar171._4_4_ = auVar108._4_4_ * auVar138._4_4_ * auVar107._4_4_;
                auVar171._8_4_ = auVar108._8_4_ * auVar138._8_4_ * auVar107._8_4_;
                auVar171._12_4_ = auVar108._12_4_ * auVar138._12_4_ * auVar107._12_4_;
                auVar239._0_4_ = auVar296._0_4_ * auVar108._0_4_;
                auVar239._4_4_ = auVar296._4_4_ * auVar108._4_4_;
                auVar239._8_4_ = auVar296._8_4_ * auVar108._8_4_;
                auVar239._12_4_ = auVar296._12_4_ * auVar108._12_4_;
                if (fVar161 < 0.0) {
                  fVar161 = sqrtf(fVar161);
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar161 = auVar85._0_4_;
                }
                auVar85 = vdpps_avx(_local_a60,auVar239,0x7f);
                fVar161 = (local_9a0 / fVar161) * (fVar181 + 1.0) +
                          auVar104._0_4_ + fVar181 * local_9a0;
                auVar107 = vdpps_avx(auVar215,auVar239,0x7f);
                auVar108 = vdpps_avx(_local_a60,auVar171,0x7f);
                auVar138 = vdpps_avx(_local_9b0,auVar239,0x7f);
                auVar162 = vdpps_avx(_local_a60,auVar215,0x7f);
                fVar225 = auVar107._0_4_ + auVar108._0_4_;
                fVar179 = auVar85._0_4_;
                auVar90._0_4_ = fVar179 * fVar179;
                auVar90._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar90._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar90._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar108 = vsubps_avx(auVar80,auVar90);
                auVar107 = vdpps_avx(_local_a60,_local_9b0,0x7f);
                fVar227 = auVar162._0_4_ - fVar179 * fVar225;
                fVar229 = auVar107._0_4_ - fVar179 * auVar138._0_4_;
                auVar107 = vrsqrtss_avx(auVar108,auVar108);
                fVar181 = auVar108._0_4_;
                fVar179 = auVar107._0_4_;
                fVar179 = fVar179 * 1.5 + fVar181 * -0.5 * fVar179 * fVar179 * fVar179;
                if (fVar181 < 0.0) {
                  local_9e0._0_4_ = fVar227;
                  local_a00._0_4_ = fVar229;
                  local_a80._0_4_ = fVar179;
                  fVar181 = sqrtf(fVar181);
                  fVar179 = (float)local_a80._0_4_;
                  fVar227 = (float)local_9e0._0_4_;
                  fVar229 = (float)local_a00._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar108,auVar108);
                  fVar181 = auVar107._0_4_;
                }
                auVar273 = ZEXT1664(auVar296);
                auVar162 = vpermilps_avx(_local_a20,0xff);
                auVar163 = vshufps_avx(auVar296,auVar296,0xff);
                fVar227 = fVar227 * fVar179 - auVar163._0_4_;
                auVar189._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = auVar138._8_4_ ^ 0x80000000;
                auVar189._12_4_ = auVar138._12_4_ ^ 0x80000000;
                auVar216._0_4_ = -fVar227;
                auVar216._4_4_ = 0x80000000;
                auVar216._8_4_ = 0x80000000;
                auVar216._12_4_ = 0x80000000;
                auVar107 = vinsertps_avx(auVar216,ZEXT416((uint)(fVar229 * fVar179)),0x1c);
                auVar138 = vmovsldup_avx(ZEXT416((uint)(fVar225 * fVar229 * fVar179 -
                                                       auVar138._0_4_ * fVar227)));
                auVar107 = vdivps_avx(auVar107,auVar138);
                auVar108 = vinsertps_avx(ZEXT416((uint)fVar225),auVar189,0x10);
                auVar108 = vdivps_avx(auVar108,auVar138);
                auVar138 = vmovsldup_avx(auVar85);
                auVar87 = ZEXT416((uint)(fVar181 - auVar162._0_4_));
                auVar162 = vmovsldup_avx(auVar87);
                auVar143._0_4_ = auVar138._0_4_ * auVar107._0_4_ + auVar162._0_4_ * auVar108._0_4_;
                auVar143._4_4_ = auVar138._4_4_ * auVar107._4_4_ + auVar162._4_4_ * auVar108._4_4_;
                auVar143._8_4_ = auVar138._8_4_ * auVar107._8_4_ + auVar162._8_4_ * auVar108._8_4_;
                auVar143._12_4_ =
                     auVar138._12_4_ * auVar107._12_4_ + auVar162._12_4_ * auVar108._12_4_;
                auVar107 = vsubps_avx(auVar167,auVar143);
                auVar311 = ZEXT1664(auVar107);
                auVar144._8_4_ = 0x7fffffff;
                auVar144._0_8_ = 0x7fffffff7fffffff;
                auVar144._12_4_ = 0x7fffffff;
                auVar167 = vandps_avx(auVar85,auVar144);
              } while (fVar161 <= auVar167._0_4_);
              auVar172._8_4_ = 0x7fffffff;
              auVar172._0_8_ = 0x7fffffff7fffffff;
              auVar172._12_4_ = 0x7fffffff;
              auVar167 = vandps_avx(auVar87,auVar172);
            } while ((float)local_820._0_4_ * 1.9073486e-06 + auVar104._0_4_ + fVar161 <=
                     auVar167._0_4_);
            fVar161 = auVar107._0_4_ + (float)local_950._0_4_;
            if ((fVar208 <= fVar161) &&
               (fVar225 = *(float *)(ray + k * 4 + 0x80), fVar161 <= fVar225)) {
              auVar167 = vmovshdup_avx(auVar107);
              fVar179 = auVar167._0_4_;
              if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                auVar167 = vrsqrtss_avx(auVar80,auVar80);
                fVar227 = auVar167._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar71].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar167 = ZEXT416((uint)(fVar227 * 1.5 +
                                           fVar180 * -0.5 * fVar227 * fVar227 * fVar227));
                  auVar167 = vshufps_avx(auVar167,auVar167,0);
                  auVar173._0_4_ = auVar167._0_4_ * (float)local_a60._0_4_;
                  auVar173._4_4_ = auVar167._4_4_ * (float)local_a60._4_4_;
                  auVar173._8_4_ = auVar167._8_4_ * fStack_a58;
                  auVar173._12_4_ = auVar167._12_4_ * fStack_a54;
                  auVar116._0_4_ = auVar296._0_4_ + auVar163._0_4_ * auVar173._0_4_;
                  auVar116._4_4_ = auVar296._4_4_ + auVar163._4_4_ * auVar173._4_4_;
                  auVar116._8_4_ = auVar296._8_4_ + auVar163._8_4_ * auVar173._8_4_;
                  auVar116._12_4_ = auVar296._12_4_ + auVar163._12_4_ * auVar173._12_4_;
                  auVar167 = vshufps_avx(auVar173,auVar173,0xc9);
                  auVar80 = vshufps_avx(auVar296,auVar296,0xc9);
                  auVar174._0_4_ = auVar80._0_4_ * auVar173._0_4_;
                  auVar174._4_4_ = auVar80._4_4_ * auVar173._4_4_;
                  auVar174._8_4_ = auVar80._8_4_ * auVar173._8_4_;
                  auVar174._12_4_ = auVar80._12_4_ * auVar173._12_4_;
                  auVar190._0_4_ = auVar296._0_4_ * auVar167._0_4_;
                  auVar190._4_4_ = auVar296._4_4_ * auVar167._4_4_;
                  auVar190._8_4_ = auVar296._8_4_ * auVar167._8_4_;
                  auVar190._12_4_ = auVar296._12_4_ * auVar167._12_4_;
                  auVar104 = vsubps_avx(auVar190,auVar174);
                  auVar167 = vshufps_avx(auVar104,auVar104,0xc9);
                  auVar80 = vshufps_avx(auVar116,auVar116,0xc9);
                  auVar191._0_4_ = auVar80._0_4_ * auVar167._0_4_;
                  auVar191._4_4_ = auVar80._4_4_ * auVar167._4_4_;
                  auVar191._8_4_ = auVar80._8_4_ * auVar167._8_4_;
                  auVar191._12_4_ = auVar80._12_4_ * auVar167._12_4_;
                  auVar167 = vshufps_avx(auVar104,auVar104,0xd2);
                  auVar117._0_4_ = auVar116._0_4_ * auVar167._0_4_;
                  auVar117._4_4_ = auVar116._4_4_ * auVar167._4_4_;
                  auVar117._8_4_ = auVar116._8_4_ * auVar167._8_4_;
                  auVar117._12_4_ = auVar116._12_4_ * auVar167._12_4_;
                  auVar167 = vsubps_avx(auVar191,auVar117);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar161;
                    uVar1 = vextractps_avx(auVar167,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar167,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_920;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar107,auVar107,0x55);
                    auVar80 = vshufps_avx(auVar167,auVar167,0x55);
                    auStack_7b0 = vshufps_avx(auVar167,auVar167,0xaa);
                    local_7a0 = vshufps_avx(auVar167,auVar167,0);
                    local_7c0 = (RTCHitN  [16])auVar80;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar77 = context->user->instPrimID[0];
                    auVar118._4_4_ = uVar77;
                    auVar118._0_4_ = uVar77;
                    auVar118._8_4_ = uVar77;
                    auVar118._12_4_ = uVar77;
                    auStack_740 = auVar118;
                    *(float *)(ray + k * 4 + 0x80) = fVar161;
                    local_940 = *local_a28;
                    local_ab0.valid = (int *)local_940;
                    local_ab0.geometryUserPtr = pGVar3->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = local_7c0;
                    local_ab0.N = 4;
                    local_ab0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar273 = ZEXT1664(auVar296);
                      auVar311 = ZEXT1664(auVar107);
                      (*pGVar3->intersectionFilterN)(&local_ab0);
                      auVar133._8_56_ = extraout_var_00;
                      auVar133._0_8_ = extraout_XMM1_Qa_00;
                      auVar118 = auVar133._0_16_;
                    }
                    if (local_940 == (undefined1  [16])0x0) {
                      auVar167 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar80 = vpcmpeqd_avx(auVar118,auVar118);
                      auVar167 = auVar167 ^ auVar80;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        auVar311 = ZEXT1664(auVar311._0_16_);
                        (*p_Var4)(&local_ab0);
                        auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                      }
                      auVar104 = vpcmpeqd_avx(local_940,_DAT_01f45a50);
                      auVar167 = auVar104 ^ auVar80;
                      if (local_940 != (undefined1  [16])0x0) {
                        auVar104 = auVar104 ^ auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])local_ab0.hit);
                        *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x10));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x20));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x30));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x40));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x50));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x60));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x70));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x80));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar80;
                      }
                    }
                    auVar91._8_8_ = 0x100000001;
                    auVar91._0_8_ = 0x100000001;
                    if ((auVar91 & auVar167) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar225;
                    }
                  }
                }
              }
            }
LAB_00809def:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar96._4_4_ = uVar1;
            auVar96._0_4_ = uVar1;
            auVar96._8_4_ = uVar1;
            auVar96._12_4_ = uVar1;
            auVar96._16_4_ = uVar1;
            auVar96._20_4_ = uVar1;
            auVar96._24_4_ = uVar1;
            auVar96._28_4_ = uVar1;
            auVar120 = vcmpps_avx(_local_840,auVar96,2);
            local_8a0 = vandps_avx(auVar120,local_8a0);
            fVar161 = (float)local_8c0._0_4_;
            fVar225 = (float)local_8c0._4_4_;
            fVar179 = fStack_8b8;
            fVar227 = fStack_8b4;
            fVar180 = fStack_8b0;
            fVar229 = fStack_8ac;
            fVar181 = fStack_8a8;
            fVar234 = fStack_8a4;
          }
          auVar120 = vandps_avx(local_680,local_660);
          auVar93 = vandps_avx(_local_880,local_860);
          auVar148._0_4_ = fVar161 + local_460._0_4_;
          auVar148._4_4_ = fVar225 + local_460._4_4_;
          auVar148._8_4_ = fVar179 + local_460._8_4_;
          auVar148._12_4_ = fVar227 + local_460._12_4_;
          auVar148._16_4_ = fVar180 + local_460._16_4_;
          auVar148._20_4_ = fVar229 + local_460._20_4_;
          auVar148._24_4_ = fVar181 + local_460._24_4_;
          auVar148._28_4_ = fVar234 + local_460._28_4_;
          auVar167 = vshufps_avx(auVar96._0_16_,auVar96._0_16_,0);
          auVar198._16_16_ = auVar167;
          auVar198._0_16_ = auVar167;
          auVar17 = vcmpps_avx(auVar148,auVar198,2);
          auVar120 = vandps_avx(auVar17,auVar120);
          auVar223._0_4_ = fVar161 + local_420._0_4_;
          auVar223._4_4_ = fVar225 + local_420._4_4_;
          auVar223._8_4_ = fVar179 + local_420._8_4_;
          auVar223._12_4_ = fVar227 + local_420._12_4_;
          auVar223._16_4_ = fVar180 + local_420._16_4_;
          auVar223._20_4_ = fVar229 + local_420._20_4_;
          auVar223._24_4_ = fVar181 + local_420._24_4_;
          auVar223._28_4_ = fVar234 + local_420._28_4_;
          auVar17 = vcmpps_avx(auVar223,auVar198,2);
          auVar93 = vandps_avx(auVar17,auVar93);
          auVar93 = vorps_avx(auVar120,auVar93);
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar93 >> 0x7f,0) != '\0') ||
                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar93 >> 0xbf,0) != '\0') ||
              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar93[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar93;
            auVar120 = vblendvps_avx(_local_420,_local_460,auVar120);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar120;
            uVar76 = vmovlps_avx(local_630);
            (&uStack_140)[uVar75 * 0xc] = uVar76;
            auStack_138[uVar75 * 0x18] = local_c88 + 1;
            uVar75 = (ulong)((int)uVar75 + 1);
          }
        }
      }
    }
    while( true ) {
      uVar77 = (uint)uVar75;
      if (uVar77 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar92._4_4_ = uVar1;
        auVar92._0_4_ = uVar1;
        auVar92._8_4_ = uVar1;
        auVar92._12_4_ = uVar1;
        auVar7 = vcmpps_avx(local_640,auVar92,2);
        uVar71 = vmovmskps_avx(auVar7);
        uVar71 = (uint)uVar78 & uVar71;
        goto LAB_00807528;
      }
      uVar75 = (ulong)(uVar77 - 1);
      lVar73 = uVar75 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar103._0_4_ = (float)local_8c0._0_4_ + auVar120._0_4_;
      auVar103._4_4_ = (float)local_8c0._4_4_ + auVar120._4_4_;
      auVar103._8_4_ = fStack_8b8 + auVar120._8_4_;
      auVar103._12_4_ = fStack_8b4 + auVar120._12_4_;
      auVar103._16_4_ = fStack_8b0 + auVar120._16_4_;
      auVar103._20_4_ = fStack_8ac + auVar120._20_4_;
      auVar103._24_4_ = fStack_8a8 + auVar120._24_4_;
      auVar103._28_4_ = fStack_8a4 + auVar120._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar177._4_4_ = uVar1;
      auVar177._0_4_ = uVar1;
      auVar177._8_4_ = uVar1;
      auVar177._12_4_ = uVar1;
      auVar177._16_4_ = uVar1;
      auVar177._20_4_ = uVar1;
      auVar177._24_4_ = uVar1;
      auVar177._28_4_ = uVar1;
      auVar17 = vcmpps_avx(auVar103,auVar177,2);
      auVar93 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar73));
      _local_7c0 = auVar93;
      auVar17 = *(undefined1 (*) [32])(auStack_180 + lVar73) & auVar17;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') break;
      uVar75 = (ulong)(uVar77 - 1);
    }
    auVar149._8_4_ = 0x7f800000;
    auVar149._0_8_ = 0x7f8000007f800000;
    auVar149._12_4_ = 0x7f800000;
    auVar149._16_4_ = 0x7f800000;
    auVar149._20_4_ = 0x7f800000;
    auVar149._24_4_ = 0x7f800000;
    auVar149._28_4_ = 0x7f800000;
    auVar120 = vblendvps_avx(auVar149,auVar120,auVar93);
    auVar17 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar17 = vminps_avx(auVar120,auVar17);
    auVar12 = vshufpd_avx(auVar17,auVar17,5);
    auVar17 = vminps_avx(auVar17,auVar12);
    auVar12 = vperm2f128_avx(auVar17,auVar17,1);
    auVar17 = vminps_avx(auVar17,auVar12);
    auVar120 = vcmpps_avx(auVar120,auVar17,0);
    auVar17 = auVar93 & auVar120;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar93 = vandps_avx(auVar120,auVar93);
    }
    auVar119._8_8_ = 0;
    auVar119._0_8_ = (&uStack_140)[uVar75 * 0xc];
    local_c88 = auStack_138[uVar75 * 0x18];
    uVar74 = vmovmskps_avx(auVar93);
    uVar72 = 0;
    if (uVar74 != 0) {
      for (; (uVar74 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar72 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar73) = _local_7c0;
    uVar74 = uVar77 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar74 = uVar77;
    }
    auVar167 = vshufps_avx(auVar119,auVar119,0);
    auVar80 = vshufps_avx(auVar119,auVar119,0x55);
    auVar80 = vsubps_avx(auVar80,auVar167);
    local_460._4_4_ = auVar167._4_4_ + auVar80._4_4_ * 0.14285715;
    local_460._0_4_ = auVar167._0_4_ + auVar80._0_4_ * 0.0;
    fStack_458 = auVar167._8_4_ + auVar80._8_4_ * 0.2857143;
    fStack_454 = auVar167._12_4_ + auVar80._12_4_ * 0.42857146;
    fStack_450 = auVar167._0_4_ + auVar80._0_4_ * 0.5714286;
    fStack_44c = auVar167._4_4_ + auVar80._4_4_ * 0.71428573;
    fStack_448 = auVar167._8_4_ + auVar80._8_4_ * 0.8571429;
    fStack_444 = auVar167._12_4_ + auVar80._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_460 + (ulong)uVar72 * 4);
    uVar75 = (ulong)uVar74;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }